

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<4,16>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  int iVar8;
  undefined4 uVar9;
  __int_type_conflict _Var10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined8 uVar35;
  ulong uVar36;
  long lVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  undefined1 auVar82 [32];
  Geometry *pGVar83;
  byte bVar84;
  ulong uVar85;
  uint uVar86;
  uint uVar87;
  long lVar88;
  long lVar89;
  Geometry *pGVar90;
  uint uVar91;
  ulong uVar92;
  byte bVar93;
  ulong uVar94;
  float fVar95;
  float fVar96;
  float fVar149;
  float fVar151;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar150;
  float fVar152;
  float fVar154;
  float fVar155;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar107 [16];
  float fVar153;
  float fVar156;
  float fVar157;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [64];
  float fVar158;
  undefined4 uVar159;
  float fVar176;
  float fVar177;
  vint4 bi_2;
  float fVar178;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [64];
  float fVar179;
  undefined8 uVar180;
  vint4 bi_1;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  float fVar186;
  float fVar187;
  float fVar199;
  vint4 bi;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  vint4 ai_2;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [64];
  vint4 ai_1;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [64];
  vint4 ai;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [64];
  float fVar231;
  float fVar232;
  undefined1 auVar230 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar241 [32];
  undefined1 auVar245 [64];
  undefined1 auVar246 [16];
  undefined1 auVar247 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  RTCFilterFunctionNArguments local_848;
  Geometry *local_818;
  undefined1 (*local_810) [32];
  LinearSpace3fa *local_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined4 local_7a0;
  undefined4 uStack_79c;
  undefined4 uStack_798;
  undefined4 uStack_794;
  undefined4 uStack_790;
  undefined4 uStack_78c;
  undefined4 uStack_788;
  undefined4 uStack_784;
  undefined1 local_780 [64];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined4 uStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined4 local_5e0;
  int local_5dc;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  float local_580 [4];
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  undefined1 auVar242 [32];
  
  PVar6 = prim[1];
  uVar85 = (ulong)(byte)PVar6;
  lVar37 = uVar85 * 0x25;
  fVar158 = *(float *)(prim + lVar37 + 0x12);
  auVar97 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar97 = vinsertps_avx(auVar97,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar98 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar98 = vinsertps_avx(auVar98,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar97 = vsubps_avx(auVar97,*(undefined1 (*) [16])(prim + lVar37 + 6));
  auVar200._0_4_ = fVar158 * auVar97._0_4_;
  auVar200._4_4_ = fVar158 * auVar97._4_4_;
  auVar200._8_4_ = fVar158 * auVar97._8_4_;
  auVar200._12_4_ = fVar158 * auVar97._12_4_;
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 4 + 6)));
  auVar107._0_4_ = fVar158 * auVar98._0_4_;
  auVar107._4_4_ = fVar158 * auVar98._4_4_;
  auVar107._8_4_ = fVar158 * auVar98._8_4_;
  auVar107._12_4_ = fVar158 * auVar98._12_4_;
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 5 + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 6 + 6)));
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0xf + 6)));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar85 + 6)));
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x1a + 6)));
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x1b + 6)));
  auVar31 = vcvtdq2ps_avx(auVar31);
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x1c + 6)));
  auVar32 = vcvtdq2ps_avx(auVar32);
  auVar217._4_4_ = auVar107._0_4_;
  auVar217._0_4_ = auVar107._0_4_;
  auVar217._8_4_ = auVar107._0_4_;
  auVar217._12_4_ = auVar107._0_4_;
  auVar33 = vshufps_avx(auVar107,auVar107,0x55);
  auVar34 = vshufps_avx(auVar107,auVar107,0xaa);
  fVar158 = auVar34._0_4_;
  auVar188._0_4_ = fVar158 * auVar104._0_4_;
  fVar176 = auVar34._4_4_;
  auVar188._4_4_ = fVar176 * auVar104._4_4_;
  fVar177 = auVar34._8_4_;
  auVar188._8_4_ = fVar177 * auVar104._8_4_;
  fVar178 = auVar34._12_4_;
  auVar188._12_4_ = fVar178 * auVar104._12_4_;
  auVar181._0_4_ = auVar29._0_4_ * fVar158;
  auVar181._4_4_ = auVar29._4_4_ * fVar176;
  auVar181._8_4_ = auVar29._8_4_ * fVar177;
  auVar181._12_4_ = auVar29._12_4_ * fVar178;
  auVar160._0_4_ = auVar32._0_4_ * fVar158;
  auVar160._4_4_ = auVar32._4_4_ * fVar176;
  auVar160._8_4_ = auVar32._8_4_ * fVar177;
  auVar160._12_4_ = auVar32._12_4_ * fVar178;
  auVar34 = vfmadd231ps_fma(auVar188,auVar33,auVar98);
  auVar102 = vfmadd231ps_fma(auVar181,auVar33,auVar28);
  auVar33 = vfmadd231ps_fma(auVar160,auVar31,auVar33);
  auVar103 = vfmadd231ps_fma(auVar34,auVar217,auVar97);
  auVar102 = vfmadd231ps_fma(auVar102,auVar217,auVar27);
  auVar105 = vfmadd231ps_fma(auVar33,auVar30,auVar217);
  auVar239._4_4_ = auVar200._0_4_;
  auVar239._0_4_ = auVar200._0_4_;
  auVar239._8_4_ = auVar200._0_4_;
  auVar239._12_4_ = auVar200._0_4_;
  auVar33 = vshufps_avx(auVar200,auVar200,0x55);
  auVar34 = vshufps_avx(auVar200,auVar200,0xaa);
  fVar158 = auVar34._0_4_;
  auVar218._0_4_ = fVar158 * auVar104._0_4_;
  fVar176 = auVar34._4_4_;
  auVar218._4_4_ = fVar176 * auVar104._4_4_;
  fVar177 = auVar34._8_4_;
  auVar218._8_4_ = fVar177 * auVar104._8_4_;
  fVar178 = auVar34._12_4_;
  auVar218._12_4_ = fVar178 * auVar104._12_4_;
  auVar210._0_4_ = auVar29._0_4_ * fVar158;
  auVar210._4_4_ = auVar29._4_4_ * fVar176;
  auVar210._8_4_ = auVar29._8_4_ * fVar177;
  auVar210._12_4_ = auVar29._12_4_ * fVar178;
  auVar201._0_4_ = auVar32._0_4_ * fVar158;
  auVar201._4_4_ = auVar32._4_4_ * fVar176;
  auVar201._8_4_ = auVar32._8_4_ * fVar177;
  auVar201._12_4_ = auVar32._12_4_ * fVar178;
  auVar98 = vfmadd231ps_fma(auVar218,auVar33,auVar98);
  auVar104 = vfmadd231ps_fma(auVar210,auVar33,auVar28);
  auVar28 = vfmadd231ps_fma(auVar201,auVar33,auVar31);
  auVar106 = vfmadd231ps_fma(auVar98,auVar239,auVar97);
  auVar107 = vfmadd231ps_fma(auVar104,auVar239,auVar27);
  auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar247 = ZEXT1664(auVar97);
  auVar160 = vfmadd231ps_fma(auVar28,auVar239,auVar30);
  auVar98 = vandps_avx512vl(auVar103,auVar97);
  auVar227._8_4_ = 0x219392ef;
  auVar227._0_8_ = 0x219392ef219392ef;
  auVar227._12_4_ = 0x219392ef;
  uVar92 = vcmpps_avx512vl(auVar98,auVar227,1);
  bVar13 = (bool)((byte)uVar92 & 1);
  auVar99._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar103._0_4_;
  bVar13 = (bool)((byte)(uVar92 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar103._4_4_;
  bVar13 = (bool)((byte)(uVar92 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar103._8_4_;
  bVar13 = (bool)((byte)(uVar92 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar103._12_4_;
  auVar98 = vandps_avx512vl(auVar102,auVar97);
  uVar92 = vcmpps_avx512vl(auVar98,auVar227,1);
  bVar13 = (bool)((byte)uVar92 & 1);
  auVar100._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar102._0_4_;
  bVar13 = (bool)((byte)(uVar92 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar102._4_4_;
  bVar13 = (bool)((byte)(uVar92 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar102._8_4_;
  bVar13 = (bool)((byte)(uVar92 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar102._12_4_;
  auVar97 = vandps_avx512vl(auVar105,auVar97);
  uVar92 = vcmpps_avx512vl(auVar97,auVar227,1);
  bVar13 = (bool)((byte)uVar92 & 1);
  auVar101._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar105._0_4_;
  bVar13 = (bool)((byte)(uVar92 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar105._4_4_;
  bVar13 = (bool)((byte)(uVar92 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar105._8_4_;
  bVar13 = (bool)((byte)(uVar92 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar105._12_4_;
  auVar98 = vrcp14ps_avx512vl(auVar99);
  auVar228._8_4_ = 0x3f800000;
  auVar228._0_8_ = 0x3f8000003f800000;
  auVar228._12_4_ = 0x3f800000;
  auVar97 = vfnmadd213ps_fma(auVar99,auVar98,auVar228);
  auVar103 = vfmadd132ps_fma(auVar97,auVar98,auVar98);
  auVar98 = vrcp14ps_avx512vl(auVar100);
  auVar97 = vfnmadd213ps_fma(auVar100,auVar98,auVar228);
  auVar105 = vfmadd132ps_fma(auVar97,auVar98,auVar98);
  auVar98 = vrcp14ps_avx512vl(auVar101);
  auVar97 = vfnmadd213ps_fma(auVar101,auVar98,auVar228);
  auVar246 = vfmadd132ps_fma(auVar97,auVar98,auVar98);
  fVar158 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar37 + 0x16)) *
            *(float *)(prim + lVar37 + 0x1a);
  auVar225._4_4_ = fVar158;
  auVar225._0_4_ = fVar158;
  auVar225._8_4_ = fVar158;
  auVar225._12_4_ = fVar158;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar85 * 7 + 6);
  auVar97 = vpmovsxwd_avx(auVar97);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar85 * 0xb + 6);
  auVar98 = vpmovsxwd_avx(auVar98);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar27 = vsubps_avx(auVar98,auVar97);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar85 * 9 + 6);
  auVar98 = vpmovsxwd_avx(auVar104);
  auVar104 = vfmadd213ps_fma(auVar27,auVar225,auVar97);
  auVar97 = vcvtdq2ps_avx(auVar98);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar85 * 0xd + 6);
  auVar98 = vpmovsxwd_avx(auVar27);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar97);
  auVar27 = vfmadd213ps_fma(auVar98,auVar225,auVar97);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar85 * 0x12 + 6);
  auVar97 = vpmovsxwd_avx(auVar28);
  auVar97 = vcvtdq2ps_avx(auVar97);
  uVar92 = (ulong)(uint)((int)(uVar85 * 5) << 2);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar85 * 2 + uVar92 + 6);
  auVar98 = vpmovsxwd_avx(auVar29);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar97);
  auVar28 = vfmadd213ps_fma(auVar98,auVar225,auVar97);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar92 + 6);
  auVar97 = vpmovsxwd_avx(auVar30);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar85 * 0x18 + 6);
  auVar98 = vpmovsxwd_avx(auVar31);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar97);
  auVar29 = vfmadd213ps_fma(auVar98,auVar225,auVar97);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar85 * 0x1d + 6);
  auVar97 = vpmovsxwd_avx(auVar32);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar85 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar98 = vpmovsxwd_avx(auVar33);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar97);
  auVar30 = vfmadd213ps_fma(auVar98,auVar225,auVar97);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar85) + 6);
  auVar97 = vpmovsxwd_avx(auVar34);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar85 * 0x23 + 6);
  auVar98 = vpmovsxwd_avx(auVar102);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar97);
  auVar98 = vfmadd213ps_fma(auVar98,auVar225,auVar97);
  auVar97 = vsubps_avx(auVar104,auVar106);
  auVar226._0_4_ = auVar103._0_4_ * auVar97._0_4_;
  auVar226._4_4_ = auVar103._4_4_ * auVar97._4_4_;
  auVar226._8_4_ = auVar103._8_4_ * auVar97._8_4_;
  auVar226._12_4_ = auVar103._12_4_ * auVar97._12_4_;
  auVar97 = vsubps_avx(auVar27,auVar106);
  auVar189._0_4_ = auVar103._0_4_ * auVar97._0_4_;
  auVar189._4_4_ = auVar103._4_4_ * auVar97._4_4_;
  auVar189._8_4_ = auVar103._8_4_ * auVar97._8_4_;
  auVar189._12_4_ = auVar103._12_4_ * auVar97._12_4_;
  auVar97 = vsubps_avx(auVar28,auVar107);
  auVar219._0_4_ = auVar105._0_4_ * auVar97._0_4_;
  auVar219._4_4_ = auVar105._4_4_ * auVar97._4_4_;
  auVar219._8_4_ = auVar105._8_4_ * auVar97._8_4_;
  auVar219._12_4_ = auVar105._12_4_ * auVar97._12_4_;
  auVar97 = vsubps_avx(auVar29,auVar107);
  auVar182._0_4_ = auVar105._0_4_ * auVar97._0_4_;
  auVar182._4_4_ = auVar105._4_4_ * auVar97._4_4_;
  auVar182._8_4_ = auVar105._8_4_ * auVar97._8_4_;
  auVar182._12_4_ = auVar105._12_4_ * auVar97._12_4_;
  auVar97 = vsubps_avx(auVar30,auVar160);
  auVar211._0_4_ = auVar246._0_4_ * auVar97._0_4_;
  auVar211._4_4_ = auVar246._4_4_ * auVar97._4_4_;
  auVar211._8_4_ = auVar246._8_4_ * auVar97._8_4_;
  auVar211._12_4_ = auVar246._12_4_ * auVar97._12_4_;
  auVar97 = vsubps_avx(auVar98,auVar160);
  auVar161._0_4_ = auVar246._0_4_ * auVar97._0_4_;
  auVar161._4_4_ = auVar246._4_4_ * auVar97._4_4_;
  auVar161._8_4_ = auVar246._8_4_ * auVar97._8_4_;
  auVar161._12_4_ = auVar246._12_4_ * auVar97._12_4_;
  auVar97 = vpminsd_avx(auVar226,auVar189);
  auVar98 = vpminsd_avx(auVar219,auVar182);
  auVar97 = vmaxps_avx(auVar97,auVar98);
  auVar98 = vpminsd_avx(auVar211,auVar161);
  uVar159 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar103._4_4_ = uVar159;
  auVar103._0_4_ = uVar159;
  auVar103._8_4_ = uVar159;
  auVar103._12_4_ = uVar159;
  auVar98 = vmaxps_avx512vl(auVar98,auVar103);
  auVar97 = vmaxps_avx(auVar97,auVar98);
  auVar105._8_4_ = 0x3f7ffffa;
  auVar105._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar105._12_4_ = 0x3f7ffffa;
  local_510 = vmulps_avx512vl(auVar97,auVar105);
  auVar97 = vpmaxsd_avx(auVar226,auVar189);
  auVar98 = vpmaxsd_avx(auVar219,auVar182);
  auVar97 = vminps_avx(auVar97,auVar98);
  auVar98 = vpmaxsd_avx(auVar211,auVar161);
  uVar159 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar246._4_4_ = uVar159;
  auVar246._0_4_ = uVar159;
  auVar246._8_4_ = uVar159;
  auVar246._12_4_ = uVar159;
  auVar98 = vminps_avx512vl(auVar98,auVar246);
  auVar97 = vminps_avx(auVar97,auVar98);
  auVar106._8_4_ = 0x3f800003;
  auVar106._0_8_ = 0x3f8000033f800003;
  auVar106._12_4_ = 0x3f800003;
  auVar97 = vmulps_avx512vl(auVar97,auVar106);
  auVar98 = vpbroadcastd_avx512vl();
  uVar180 = vcmpps_avx512vl(local_510,auVar97,2);
  uVar92 = vpcmpgtd_avx512vl(auVar98,_DAT_01f7fcf0);
  uVar92 = ((byte)uVar180 & 0xf) & uVar92;
  if ((char)uVar92 != '\0') {
    local_808 = pre->ray_space + k;
    local_810 = (undefined1 (*) [32])local_100;
    auVar175 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar175);
    auVar175 = ZEXT464(0xbf800000);
    do {
      lVar37 = 0;
      for (uVar85 = uVar92; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
        lVar37 = lVar37 + 1;
      }
      uVar91 = *(uint *)(prim + 2);
      uVar7 = *(uint *)(prim + lVar37 * 4 + 6);
      pGVar90 = (context->scene->geometries).items[uVar91].ptr;
      uVar85 = (ulong)*(uint *)(*(long *)&pGVar90->field_0x58 +
                               (ulong)uVar7 *
                               pGVar90[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar158 = (pGVar90->time_range).lower;
      fVar158 = pGVar90->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x1c0) - fVar158) /
                ((pGVar90->time_range).upper - fVar158));
      auVar97 = vroundss_avx(ZEXT416((uint)fVar158),ZEXT416((uint)fVar158),9);
      auVar98 = vaddss_avx512f(ZEXT416((uint)pGVar90->fnumTimeSegments),auVar175._0_16_);
      auVar97 = vminss_avx(auVar97,auVar98);
      auVar97 = vmaxss_avx(ZEXT816(0) << 0x20,auVar97);
      fVar158 = fVar158 - auVar97._0_4_;
      _Var10 = pGVar90[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar89 = (long)(int)auVar97._0_4_ * 0x38;
      lVar37 = *(long *)(_Var10 + 0x10 + lVar89);
      lVar88 = *(long *)(_Var10 + 0x38 + lVar89);
      lVar11 = *(long *)(_Var10 + 0x48 + lVar89);
      auVar183._4_4_ = fVar158;
      auVar183._0_4_ = fVar158;
      auVar183._8_4_ = fVar158;
      auVar183._12_4_ = fVar158;
      pfVar3 = (float *)(lVar88 + uVar85 * lVar11);
      auVar230._0_4_ = fVar158 * *pfVar3;
      auVar230._4_4_ = fVar158 * pfVar3[1];
      auVar230._8_4_ = fVar158 * pfVar3[2];
      auVar230._12_4_ = fVar158 * pfVar3[3];
      pfVar3 = (float *)(lVar88 + (uVar85 + 1) * lVar11);
      auVar233._0_4_ = fVar158 * *pfVar3;
      auVar233._4_4_ = fVar158 * pfVar3[1];
      auVar233._8_4_ = fVar158 * pfVar3[2];
      auVar233._12_4_ = fVar158 * pfVar3[3];
      auVar97 = vmulps_avx512vl(auVar183,*(undefined1 (*) [16])(lVar88 + (uVar85 + 2) * lVar11));
      auVar98 = vmulps_avx512vl(auVar183,*(undefined1 (*) [16])(lVar88 + lVar11 * (uVar85 + 3)));
      lVar88 = *(long *)(_Var10 + lVar89);
      fVar158 = 1.0 - fVar158;
      auVar162._4_4_ = fVar158;
      auVar162._0_4_ = fVar158;
      auVar162._8_4_ = fVar158;
      auVar162._12_4_ = fVar158;
      auVar27 = vfmadd231ps_fma(auVar230,auVar162,*(undefined1 (*) [16])(lVar88 + lVar37 * uVar85));
      auVar28 = vfmadd231ps_fma(auVar233,auVar162,
                                *(undefined1 (*) [16])(lVar88 + lVar37 * (uVar85 + 1)));
      auVar102 = vfmadd231ps_avx512vl
                           (auVar97,auVar162,*(undefined1 (*) [16])(lVar88 + lVar37 * (uVar85 + 2)))
      ;
      auVar103 = vfmadd231ps_avx512vl
                           (auVar98,auVar162,*(undefined1 (*) [16])(lVar88 + lVar37 * (uVar85 + 3)))
      ;
      iVar8 = (int)pGVar90[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar97 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40))
                              ,0x1c);
      lVar37 = (long)iVar8 * 0x44;
      auVar97 = vinsertps_avx(auVar97,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      auVar104 = vsubps_avx(auVar27,auVar97);
      uVar159 = auVar104._0_4_;
      auVar190._4_4_ = uVar159;
      auVar190._0_4_ = uVar159;
      auVar190._8_4_ = uVar159;
      auVar190._12_4_ = uVar159;
      auVar98 = vshufps_avx(auVar104,auVar104,0x55);
      aVar4 = (local_808->vx).field_0;
      aVar5 = (local_808->vy).field_0;
      fVar158 = (local_808->vz).field_0.m128[0];
      fVar176 = *(float *)((long)&(local_808->vz).field_0 + 4);
      fVar177 = *(float *)((long)&(local_808->vz).field_0 + 8);
      fVar178 = *(float *)((long)&(local_808->vz).field_0 + 0xc);
      auVar104 = vshufps_avx(auVar104,auVar104,0xaa);
      auVar236._0_4_ = fVar158 * auVar104._0_4_;
      auVar236._4_4_ = fVar176 * auVar104._4_4_;
      auVar236._8_4_ = fVar177 * auVar104._8_4_;
      auVar236._12_4_ = fVar178 * auVar104._12_4_;
      auVar98 = vfmadd231ps_fma(auVar236,(undefined1  [16])aVar5,auVar98);
      auVar29 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar4,auVar190);
      auVar104 = vsubps_avx(auVar28,auVar97);
      uVar159 = auVar104._0_4_;
      auVar191._4_4_ = uVar159;
      auVar191._0_4_ = uVar159;
      auVar191._8_4_ = uVar159;
      auVar191._12_4_ = uVar159;
      auVar98 = vshufps_avx(auVar104,auVar104,0x55);
      auVar104 = vshufps_avx(auVar104,auVar104,0xaa);
      auVar237._0_4_ = fVar158 * auVar104._0_4_;
      auVar237._4_4_ = fVar176 * auVar104._4_4_;
      auVar237._8_4_ = fVar177 * auVar104._8_4_;
      auVar237._12_4_ = fVar178 * auVar104._12_4_;
      auVar98 = vfmadd231ps_fma(auVar237,(undefined1  [16])aVar5,auVar98);
      auVar30 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar4,auVar191);
      auVar104 = vsubps_avx512vl(auVar102,auVar97);
      uVar159 = auVar104._0_4_;
      auVar192._4_4_ = uVar159;
      auVar192._0_4_ = uVar159;
      auVar192._8_4_ = uVar159;
      auVar192._12_4_ = uVar159;
      auVar98 = vshufps_avx(auVar104,auVar104,0x55);
      auVar104 = vshufps_avx(auVar104,auVar104,0xaa);
      auVar238._0_4_ = fVar158 * auVar104._0_4_;
      auVar238._4_4_ = fVar176 * auVar104._4_4_;
      auVar238._8_4_ = fVar177 * auVar104._8_4_;
      auVar238._12_4_ = fVar178 * auVar104._12_4_;
      auVar98 = vfmadd231ps_fma(auVar238,(undefined1  [16])aVar5,auVar98);
      auVar104 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar4,auVar192);
      auVar98 = vsubps_avx512vl(auVar103,auVar97);
      uVar159 = auVar98._0_4_;
      auVar184._4_4_ = uVar159;
      auVar184._0_4_ = uVar159;
      auVar184._8_4_ = uVar159;
      auVar184._12_4_ = uVar159;
      auVar97 = vshufps_avx(auVar98,auVar98,0x55);
      auVar98 = vshufps_avx(auVar98,auVar98,0xaa);
      auVar240._0_4_ = fVar158 * auVar98._0_4_;
      auVar240._4_4_ = fVar176 * auVar98._4_4_;
      auVar240._8_4_ = fVar177 * auVar98._8_4_;
      auVar240._12_4_ = fVar178 * auVar98._12_4_;
      auVar97 = vfmadd231ps_fma(auVar240,(undefined1  [16])aVar5,auVar97);
      auVar31 = vfmadd231ps_fma(auVar97,(undefined1  [16])aVar4,auVar184);
      auVar122 = *(undefined1 (*) [32])(bezier_basis0 + lVar37);
      uVar159 = auVar29._0_4_;
      local_660._4_4_ = uVar159;
      local_660._0_4_ = uVar159;
      local_660._8_4_ = uVar159;
      local_660._12_4_ = uVar159;
      local_660._16_4_ = uVar159;
      local_660._20_4_ = uVar159;
      local_660._24_4_ = uVar159;
      local_660._28_4_ = uVar159;
      auVar123 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0x484);
      auVar108._8_4_ = 1;
      auVar108._0_8_ = 0x100000001;
      auVar108._12_4_ = 1;
      auVar108._16_4_ = 1;
      auVar108._20_4_ = 1;
      auVar108._24_4_ = 1;
      auVar108._28_4_ = 1;
      local_680 = vpermps_avx2(auVar108,ZEXT1632(auVar29));
      uVar159 = auVar30._0_4_;
      auVar202._4_4_ = uVar159;
      auVar202._0_4_ = uVar159;
      auVar202._8_4_ = uVar159;
      auVar202._12_4_ = uVar159;
      local_6a0._16_4_ = uVar159;
      local_6a0._0_16_ = auVar202;
      local_6a0._20_4_ = uVar159;
      local_6a0._24_4_ = uVar159;
      local_6a0._28_4_ = uVar159;
      local_6c0 = vpermps_avx512vl(auVar108,ZEXT1632(auVar30));
      auVar121 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0x908);
      local_6e0 = vbroadcastss_avx512vl(auVar104);
      local_700 = vpermps_avx512vl(auVar108,ZEXT1632(auVar104));
      auVar120 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0xd8c);
      uVar159 = auVar31._0_4_;
      local_720._4_4_ = uVar159;
      local_720._0_4_ = uVar159;
      fStack_718 = (float)uVar159;
      fStack_714 = (float)uVar159;
      fStack_710 = (float)uVar159;
      fStack_70c = (float)uVar159;
      fStack_708 = (float)uVar159;
      register0x0000139c = uVar159;
      _local_740 = vpermps_avx512vl(auVar108,ZEXT1632(auVar31));
      auVar108 = vmulps_avx512vl(_local_720,auVar120);
      auVar109 = vmulps_avx512vl(_local_740,auVar120);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar121,local_6e0);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar121,local_700);
      auVar97 = vfmadd231ps_fma(auVar108,auVar123,local_6a0);
      auVar110 = vfmadd231ps_avx512vl(auVar109,auVar123,local_6c0);
      auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),auVar122,local_660);
      auVar224 = ZEXT3264(auVar111);
      auVar108 = *(undefined1 (*) [32])(bezier_basis1 + lVar37);
      auVar109 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0x484);
      auVar119 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0x908);
      auVar112 = vfmadd231ps_avx512vl(auVar110,auVar122,local_680);
      auVar216 = ZEXT3264(auVar112);
      auVar110 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0xd8c);
      auVar113 = vmulps_avx512vl(_local_720,auVar110);
      auVar114 = vmulps_avx512vl(_local_740,auVar110);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar119,local_6e0);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar119,local_700);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar109,local_6a0);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar109,local_6c0);
      auVar32 = vfmadd231ps_fma(auVar113,auVar108,local_660);
      auVar229 = ZEXT1664(auVar32);
      auVar33 = vfmadd231ps_fma(auVar114,auVar108,local_680);
      auVar114 = vsubps_avx512vl(ZEXT1632(auVar32),auVar111);
      auVar115 = vsubps_avx512vl(ZEXT1632(auVar33),auVar112);
      auVar113 = vmulps_avx512vl(auVar112,auVar114);
      auVar116 = vmulps_avx512vl(auVar111,auVar115);
      auVar113 = vsubps_avx512vl(auVar113,auVar116);
      auVar97 = vshufps_avx(auVar27,auVar27,0xff);
      uVar180 = auVar97._0_8_;
      local_320._8_8_ = uVar180;
      local_320._0_8_ = uVar180;
      local_320._16_8_ = uVar180;
      local_320._24_8_ = uVar180;
      auVar97 = vshufps_avx(auVar28,auVar28,0xff);
      local_340 = vbroadcastsd_avx512vl(auVar97);
      auVar97 = vshufps_avx512vl(auVar102,auVar102,0xff);
      local_360 = vbroadcastsd_avx512vl(auVar97);
      auVar97 = vshufps_avx512vl(auVar103,auVar103,0xff);
      uVar180 = auVar97._0_8_;
      local_380._8_8_ = uVar180;
      local_380._0_8_ = uVar180;
      local_380._16_8_ = uVar180;
      local_380._24_8_ = uVar180;
      auVar116 = vmulps_avx512vl(local_380,auVar120);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar121,local_360);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar123,local_340);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar122,local_320);
      auVar117 = vmulps_avx512vl(local_380,auVar110);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar119,local_360);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar109,local_340);
      auVar34 = vfmadd231ps_fma(auVar117,auVar108,local_320);
      auVar117 = vmulps_avx512vl(auVar115,auVar115);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar114,auVar114);
      auVar118 = vmaxps_avx512vl(auVar116,ZEXT1632(auVar34));
      auVar118 = vmulps_avx512vl(auVar118,auVar118);
      auVar117 = vmulps_avx512vl(auVar118,auVar117);
      auVar113 = vmulps_avx512vl(auVar113,auVar113);
      uVar180 = vcmpps_avx512vl(auVar113,auVar117,2);
      auVar97 = vblendps_avx(auVar29,auVar27,8);
      auVar246 = auVar247._0_16_;
      auVar98 = vandps_avx512vl(auVar97,auVar246);
      auVar97 = vblendps_avx(auVar30,auVar28,8);
      auVar97 = vandps_avx512vl(auVar97,auVar246);
      auVar98 = vmaxps_avx(auVar98,auVar97);
      auVar97 = vblendps_avx(auVar104,auVar102,8);
      auVar105 = vandps_avx512vl(auVar97,auVar246);
      auVar97 = vblendps_avx(auVar31,auVar103,8);
      auVar97 = vandps_avx512vl(auVar97,auVar246);
      auVar97 = vmaxps_avx(auVar105,auVar97);
      auVar97 = vmaxps_avx(auVar98,auVar97);
      auVar98 = vmovshdup_avx(auVar97);
      auVar98 = vmaxss_avx(auVar98,auVar97);
      auVar97 = vshufpd_avx(auVar97,auVar97,1);
      auVar97 = vmaxss_avx(auVar97,auVar98);
      auVar98 = vcvtsi2ss_avx512f(auVar246,iVar8);
      local_480._0_16_ = auVar98;
      auVar118._0_4_ = auVar98._0_4_;
      auVar118._4_4_ = auVar118._0_4_;
      auVar118._8_4_ = auVar118._0_4_;
      auVar118._12_4_ = auVar118._0_4_;
      auVar118._16_4_ = auVar118._0_4_;
      auVar118._20_4_ = auVar118._0_4_;
      auVar118._24_4_ = auVar118._0_4_;
      auVar118._28_4_ = auVar118._0_4_;
      uVar35 = vcmpps_avx512vl(auVar118,_DAT_01faff40,0xe);
      bVar93 = (byte)uVar180 & (byte)uVar35;
      auVar97 = vmulss_avx512f(auVar97,SUB6416(ZEXT464(0x35000000),0));
      local_7e0._0_16_ = auVar97;
      auVar113 = local_7e0;
      auVar117._8_4_ = 2;
      auVar117._0_8_ = 0x200000002;
      auVar117._12_4_ = 2;
      auVar117._16_4_ = 2;
      auVar117._20_4_ = 2;
      auVar117._24_4_ = 2;
      auVar117._28_4_ = 2;
      local_4a0 = vpermps_avx2(auVar117,ZEXT1632(auVar29));
      local_4c0 = vpermps_avx2(auVar117,ZEXT1632(auVar30));
      local_4e0 = vpermps_avx2(auVar117,ZEXT1632(auVar104));
      local_500 = vpermps_avx2(auVar117,ZEXT1632(auVar31));
      local_7a0 = *(undefined4 *)(ray + k * 4 + 0xc0);
      uStack_79c = 0;
      uStack_798 = 0;
      uStack_794 = 0;
      local_860 = auVar27._0_8_;
      uStack_858 = auVar27._8_8_;
      local_870 = auVar28._0_8_;
      uStack_868 = auVar28._8_8_;
      local_880 = auVar102._0_8_;
      uStack_878 = auVar102._8_8_;
      local_890._0_4_ = auVar103._0_4_;
      fVar158 = (float)local_890;
      local_890._4_4_ = auVar103._4_4_;
      fVar176 = local_890._4_4_;
      uStack_888._0_4_ = auVar103._8_4_;
      fVar177 = (float)uStack_888;
      uStack_888._4_4_ = auVar103._12_4_;
      fVar178 = uStack_888._4_4_;
      local_890 = auVar103._0_8_;
      uStack_888 = auVar103._8_8_;
      local_7e0 = auVar113;
      if (bVar93 != 0) {
        auVar110 = vmulps_avx512vl(local_500,auVar110);
        auVar119 = vfmadd213ps_avx512vl(auVar119,local_4e0,auVar110);
        auVar109 = vfmadd213ps_avx512vl(auVar109,local_4c0,auVar119);
        auVar110 = vfmadd213ps_avx512vl(auVar108,local_4a0,auVar109);
        auVar120 = vmulps_avx512vl(local_500,auVar120);
        auVar121 = vfmadd213ps_avx512vl(auVar121,local_4e0,auVar120);
        auVar109 = vfmadd213ps_avx512vl(auVar123,local_4c0,auVar121);
        auVar123 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0x1210);
        auVar121 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0x1694);
        auVar120 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0x1b18);
        auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0x1f9c);
        auVar113 = vfmadd213ps_avx512vl(auVar122,local_4a0,auVar109);
        auVar122 = vmulps_avx512vl(_local_720,auVar108);
        auVar109 = vmulps_avx512vl(_local_740,auVar108);
        auVar108 = vmulps_avx512vl(local_500,auVar108);
        auVar122 = vfmadd231ps_avx512vl(auVar122,auVar120,local_6e0);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar120,local_700);
        auVar120 = vfmadd231ps_avx512vl(auVar108,local_4e0,auVar120);
        auVar122 = vfmadd231ps_avx512vl(auVar122,auVar121,local_6a0);
        auVar108 = vfmadd231ps_avx512vl(auVar109,auVar121,local_6c0);
        auVar109 = vfmadd231ps_avx512vl(auVar120,local_4c0,auVar121);
        auVar98 = vfmadd231ps_fma(auVar122,auVar123,local_660);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar123,local_680);
        auVar122 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0x1210);
        auVar121 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0x1b18);
        auVar120 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0x1f9c);
        auVar109 = vfmadd231ps_avx512vl(auVar109,local_4a0,auVar123);
        auVar123 = vmulps_avx512vl(_local_720,auVar120);
        auVar119 = vmulps_avx512vl(_local_740,auVar120);
        auVar120 = vmulps_avx512vl(local_500,auVar120);
        auVar117 = vfmadd231ps_avx512vl(auVar123,auVar121,local_6e0);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar121,local_700);
        auVar121 = vfmadd231ps_avx512vl(auVar120,local_4e0,auVar121);
        auVar247 = ZEXT1664(auVar246);
        auVar123 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0x1694);
        auVar120 = vfmadd231ps_avx512vl(auVar117,auVar123,local_6a0);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar123,local_6c0);
        auVar123 = vfmadd231ps_avx512vl(auVar121,local_4c0,auVar123);
        auVar175 = ZEXT1664(auVar175._0_16_);
        auVar104 = vfmadd231ps_fma(auVar120,auVar122,local_660);
        auVar121 = vfmadd231ps_avx512vl(auVar119,auVar122,local_680);
        auVar120 = vfmadd231ps_avx512vl(auVar123,local_4a0,auVar122);
        auVar241._8_4_ = 0x7fffffff;
        auVar241._0_8_ = 0x7fffffff7fffffff;
        auVar241._12_4_ = 0x7fffffff;
        auVar241._16_4_ = 0x7fffffff;
        auVar241._20_4_ = 0x7fffffff;
        auVar241._24_4_ = 0x7fffffff;
        auVar241._28_4_ = 0x7fffffff;
        auVar122 = vandps_avx(ZEXT1632(auVar98),auVar241);
        auVar123 = vandps_avx(auVar108,auVar241);
        auVar123 = vmaxps_avx(auVar122,auVar123);
        auVar122 = vandps_avx(auVar109,auVar241);
        auVar122 = vmaxps_avx(auVar123,auVar122);
        local_7e0._0_4_ = auVar97._0_4_;
        auVar234._4_4_ = local_7e0._0_4_;
        auVar234._0_4_ = local_7e0._0_4_;
        auVar234._8_4_ = local_7e0._0_4_;
        auVar234._12_4_ = local_7e0._0_4_;
        auVar234._16_4_ = local_7e0._0_4_;
        auVar234._20_4_ = local_7e0._0_4_;
        auVar234._24_4_ = local_7e0._0_4_;
        auVar234._28_4_ = local_7e0._0_4_;
        uVar85 = vcmpps_avx512vl(auVar122,auVar234,1);
        bVar13 = (bool)((byte)uVar85 & 1);
        auVar124._0_4_ = (float)((uint)bVar13 * auVar114._0_4_ | (uint)!bVar13 * auVar98._0_4_);
        bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar124._4_4_ = (float)((uint)bVar13 * auVar114._4_4_ | (uint)!bVar13 * auVar98._4_4_);
        bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar124._8_4_ = (float)((uint)bVar13 * auVar114._8_4_ | (uint)!bVar13 * auVar98._8_4_);
        bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar124._12_4_ = (float)((uint)bVar13 * auVar114._12_4_ | (uint)!bVar13 * auVar98._12_4_);
        fVar231 = (float)((uint)((byte)(uVar85 >> 4) & 1) * auVar114._16_4_);
        auVar124._16_4_ = fVar231;
        fVar187 = (float)((uint)((byte)(uVar85 >> 5) & 1) * auVar114._20_4_);
        auVar124._20_4_ = fVar187;
        fVar232 = (float)((uint)((byte)(uVar85 >> 6) & 1) * auVar114._24_4_);
        auVar124._24_4_ = fVar232;
        auVar124._28_4_ = (uint)(byte)(uVar85 >> 7) * auVar114._28_4_;
        bVar13 = (bool)((byte)uVar85 & 1);
        auVar125._0_4_ = (float)((uint)bVar13 * auVar115._0_4_ | (uint)!bVar13 * auVar108._0_4_);
        bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar125._4_4_ = (float)((uint)bVar13 * auVar115._4_4_ | (uint)!bVar13 * auVar108._4_4_);
        bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar125._8_4_ = (float)((uint)bVar13 * auVar115._8_4_ | (uint)!bVar13 * auVar108._8_4_);
        bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar125._12_4_ = (float)((uint)bVar13 * auVar115._12_4_ | (uint)!bVar13 * auVar108._12_4_);
        bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar125._16_4_ = (float)((uint)bVar13 * auVar115._16_4_ | (uint)!bVar13 * auVar108._16_4_);
        bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar125._20_4_ = (float)((uint)bVar13 * auVar115._20_4_ | (uint)!bVar13 * auVar108._20_4_);
        bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar125._24_4_ = (float)((uint)bVar13 * auVar115._24_4_ | (uint)!bVar13 * auVar108._24_4_);
        bVar13 = SUB81(uVar85 >> 7,0);
        auVar125._28_4_ = (uint)bVar13 * auVar115._28_4_ | (uint)!bVar13 * auVar108._28_4_;
        auVar122 = vandps_avx(auVar241,ZEXT1632(auVar104));
        auVar123 = vandps_avx(auVar121,auVar241);
        auVar123 = vmaxps_avx(auVar122,auVar123);
        auVar122 = vandps_avx(auVar120,auVar241);
        auVar122 = vmaxps_avx(auVar123,auVar122);
        uVar85 = vcmpps_avx512vl(auVar122,auVar234,1);
        bVar13 = (bool)((byte)uVar85 & 1);
        auVar126._0_4_ = (float)((uint)bVar13 * auVar114._0_4_ | (uint)!bVar13 * auVar104._0_4_);
        bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar126._4_4_ = (float)((uint)bVar13 * auVar114._4_4_ | (uint)!bVar13 * auVar104._4_4_);
        bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar126._8_4_ = (float)((uint)bVar13 * auVar114._8_4_ | (uint)!bVar13 * auVar104._8_4_);
        bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar126._12_4_ = (float)((uint)bVar13 * auVar114._12_4_ | (uint)!bVar13 * auVar104._12_4_);
        fVar199 = (float)((uint)((byte)(uVar85 >> 4) & 1) * auVar114._16_4_);
        auVar126._16_4_ = fVar199;
        fVar179 = (float)((uint)((byte)(uVar85 >> 5) & 1) * auVar114._20_4_);
        auVar126._20_4_ = fVar179;
        fVar186 = (float)((uint)((byte)(uVar85 >> 6) & 1) * auVar114._24_4_);
        auVar126._24_4_ = fVar186;
        uVar86 = (uint)(byte)(uVar85 >> 7) * auVar114._28_4_;
        auVar126._28_4_ = uVar86;
        bVar13 = (bool)((byte)uVar85 & 1);
        auVar127._0_4_ = (float)((uint)bVar13 * auVar115._0_4_ | (uint)!bVar13 * auVar121._0_4_);
        bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar127._4_4_ = (float)((uint)bVar13 * auVar115._4_4_ | (uint)!bVar13 * auVar121._4_4_);
        bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar127._8_4_ = (float)((uint)bVar13 * auVar115._8_4_ | (uint)!bVar13 * auVar121._8_4_);
        bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar127._12_4_ = (float)((uint)bVar13 * auVar115._12_4_ | (uint)!bVar13 * auVar121._12_4_);
        bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar127._16_4_ = (float)((uint)bVar13 * auVar115._16_4_ | (uint)!bVar13 * auVar121._16_4_);
        bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar127._20_4_ = (float)((uint)bVar13 * auVar115._20_4_ | (uint)!bVar13 * auVar121._20_4_);
        bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar127._24_4_ = (float)((uint)bVar13 * auVar115._24_4_ | (uint)!bVar13 * auVar121._24_4_);
        bVar13 = SUB81(uVar85 >> 7,0);
        auVar127._28_4_ = (uint)bVar13 * auVar115._28_4_ | (uint)!bVar13 * auVar121._28_4_;
        auVar106 = vxorps_avx512vl(auVar202,auVar202);
        auVar122 = vfmadd213ps_avx512vl(auVar124,auVar124,ZEXT1632(auVar106));
        auVar97 = vfmadd231ps_fma(auVar122,auVar125,auVar125);
        auVar123 = vrsqrt14ps_avx512vl(ZEXT1632(auVar97));
        fVar95 = auVar123._0_4_;
        fVar96 = auVar123._4_4_;
        fVar149 = auVar123._8_4_;
        fVar150 = auVar123._12_4_;
        fVar151 = auVar123._16_4_;
        fVar152 = auVar123._20_4_;
        fVar154 = auVar123._24_4_;
        auVar122._4_4_ = fVar96 * fVar96 * fVar96 * auVar97._4_4_ * -0.5;
        auVar122._0_4_ = fVar95 * fVar95 * fVar95 * auVar97._0_4_ * -0.5;
        auVar122._8_4_ = fVar149 * fVar149 * fVar149 * auVar97._8_4_ * -0.5;
        auVar122._12_4_ = fVar150 * fVar150 * fVar150 * auVar97._12_4_ * -0.5;
        auVar122._16_4_ = fVar151 * fVar151 * fVar151 * -0.0;
        auVar122._20_4_ = fVar152 * fVar152 * fVar152 * -0.0;
        auVar122._24_4_ = fVar154 * fVar154 * fVar154 * -0.0;
        auVar122._28_4_ = auVar120._28_4_;
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar122 = vfmadd231ps_avx512vl(auVar122,auVar108,auVar123);
        auVar123._4_4_ = auVar125._4_4_ * auVar122._4_4_;
        auVar123._0_4_ = auVar125._0_4_ * auVar122._0_4_;
        auVar123._8_4_ = auVar125._8_4_ * auVar122._8_4_;
        auVar123._12_4_ = auVar125._12_4_ * auVar122._12_4_;
        auVar123._16_4_ = auVar125._16_4_ * auVar122._16_4_;
        auVar123._20_4_ = auVar125._20_4_ * auVar122._20_4_;
        auVar123._24_4_ = auVar125._24_4_ * auVar122._24_4_;
        auVar123._28_4_ = 0;
        auVar121._4_4_ = auVar122._4_4_ * -auVar124._4_4_;
        auVar121._0_4_ = auVar122._0_4_ * -auVar124._0_4_;
        auVar121._8_4_ = auVar122._8_4_ * -auVar124._8_4_;
        auVar121._12_4_ = auVar122._12_4_ * -auVar124._12_4_;
        auVar121._16_4_ = auVar122._16_4_ * -fVar231;
        auVar121._20_4_ = auVar122._20_4_ * -fVar187;
        auVar121._24_4_ = auVar122._24_4_ * -fVar232;
        auVar121._28_4_ = auVar125._28_4_;
        auVar122 = vmulps_avx512vl(auVar122,ZEXT1632(auVar106));
        auVar115 = ZEXT1632(auVar106);
        auVar120 = vfmadd213ps_avx512vl(auVar126,auVar126,auVar115);
        auVar97 = vfmadd231ps_fma(auVar120,auVar127,auVar127);
        auVar119 = vrsqrt14ps_avx512vl(ZEXT1632(auVar97));
        fVar187 = auVar119._0_4_;
        fVar231 = auVar119._4_4_;
        fVar232 = auVar119._8_4_;
        fVar95 = auVar119._12_4_;
        fVar96 = auVar119._16_4_;
        fVar149 = auVar119._20_4_;
        fVar150 = auVar119._24_4_;
        auVar120._4_4_ = fVar231 * fVar231 * fVar231 * auVar97._4_4_ * -0.5;
        auVar120._0_4_ = fVar187 * fVar187 * fVar187 * auVar97._0_4_ * -0.5;
        auVar120._8_4_ = fVar232 * fVar232 * fVar232 * auVar97._8_4_ * -0.5;
        auVar120._12_4_ = fVar95 * fVar95 * fVar95 * auVar97._12_4_ * -0.5;
        auVar120._16_4_ = fVar96 * fVar96 * fVar96 * -0.0;
        auVar120._20_4_ = fVar149 * fVar149 * fVar149 * -0.0;
        auVar120._24_4_ = fVar150 * fVar150 * fVar150 * -0.0;
        auVar120._28_4_ = 0;
        auVar120 = vfmadd231ps_avx512vl(auVar120,auVar108,auVar119);
        auVar109._4_4_ = auVar127._4_4_ * auVar120._4_4_;
        auVar109._0_4_ = auVar127._0_4_ * auVar120._0_4_;
        auVar109._8_4_ = auVar127._8_4_ * auVar120._8_4_;
        auVar109._12_4_ = auVar127._12_4_ * auVar120._12_4_;
        auVar109._16_4_ = auVar127._16_4_ * auVar120._16_4_;
        auVar109._20_4_ = auVar127._20_4_ * auVar120._20_4_;
        auVar109._24_4_ = auVar127._24_4_ * auVar120._24_4_;
        auVar109._28_4_ = auVar119._28_4_;
        auVar119._4_4_ = -auVar126._4_4_ * auVar120._4_4_;
        auVar119._0_4_ = -auVar126._0_4_ * auVar120._0_4_;
        auVar119._8_4_ = -auVar126._8_4_ * auVar120._8_4_;
        auVar119._12_4_ = -auVar126._12_4_ * auVar120._12_4_;
        auVar119._16_4_ = -fVar199 * auVar120._16_4_;
        auVar119._20_4_ = -fVar179 * auVar120._20_4_;
        auVar119._24_4_ = -fVar186 * auVar120._24_4_;
        auVar119._28_4_ = uVar86 ^ 0x80000000;
        auVar120 = vmulps_avx512vl(auVar120,auVar115);
        auVar97 = vfmadd213ps_fma(auVar123,auVar116,auVar111);
        auVar98 = vfmadd213ps_fma(auVar121,auVar116,auVar112);
        auVar108 = vfmadd213ps_avx512vl(auVar122,auVar116,auVar113);
        auVar114 = vfmadd213ps_avx512vl(auVar109,ZEXT1632(auVar34),ZEXT1632(auVar32));
        auVar103 = vfnmadd213ps_fma(auVar123,auVar116,auVar111);
        auVar111 = ZEXT1632(auVar34);
        auVar104 = vfmadd213ps_fma(auVar119,auVar111,ZEXT1632(auVar33));
        auVar105 = vfnmadd213ps_fma(auVar121,auVar116,auVar112);
        auVar29 = vfmadd213ps_fma(auVar120,auVar111,auVar110);
        auVar123 = vfnmadd231ps_avx512vl(auVar113,auVar116,auVar122);
        auVar32 = vfnmadd213ps_fma(auVar109,auVar111,ZEXT1632(auVar32));
        auVar33 = vfnmadd213ps_fma(auVar119,auVar111,ZEXT1632(auVar33));
        auVar246 = vfnmadd231ps_fma(auVar110,ZEXT1632(auVar34),auVar120);
        auVar121 = vsubps_avx512vl(auVar114,ZEXT1632(auVar103));
        auVar122 = vsubps_avx(ZEXT1632(auVar104),ZEXT1632(auVar105));
        auVar120 = vsubps_avx512vl(ZEXT1632(auVar29),auVar123);
        auVar109 = vmulps_avx512vl(auVar122,auVar123);
        auVar30 = vfmsub231ps_fma(auVar109,ZEXT1632(auVar105),auVar120);
        auVar110._4_4_ = auVar103._4_4_ * auVar120._4_4_;
        auVar110._0_4_ = auVar103._0_4_ * auVar120._0_4_;
        auVar110._8_4_ = auVar103._8_4_ * auVar120._8_4_;
        auVar110._12_4_ = auVar103._12_4_ * auVar120._12_4_;
        auVar110._16_4_ = auVar120._16_4_ * 0.0;
        auVar110._20_4_ = auVar120._20_4_ * 0.0;
        auVar110._24_4_ = auVar120._24_4_ * 0.0;
        auVar110._28_4_ = auVar120._28_4_;
        auVar120 = vfmsub231ps_avx512vl(auVar110,auVar123,auVar121);
        auVar113._4_4_ = auVar105._4_4_ * auVar121._4_4_;
        auVar113._0_4_ = auVar105._0_4_ * auVar121._0_4_;
        auVar113._8_4_ = auVar105._8_4_ * auVar121._8_4_;
        auVar113._12_4_ = auVar105._12_4_ * auVar121._12_4_;
        auVar113._16_4_ = auVar121._16_4_ * 0.0;
        auVar113._20_4_ = auVar121._20_4_ * 0.0;
        auVar113._24_4_ = auVar121._24_4_ * 0.0;
        auVar113._28_4_ = auVar121._28_4_;
        auVar31 = vfmsub231ps_fma(auVar113,ZEXT1632(auVar103),auVar122);
        auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar31),auVar115,auVar120);
        auVar122 = vfmadd231ps_avx512vl(auVar122,auVar115,ZEXT1632(auVar30));
        auVar117 = ZEXT1632(auVar106);
        uVar85 = vcmpps_avx512vl(auVar122,auVar117,2);
        bVar84 = (byte)uVar85;
        fVar95 = (float)((uint)(bVar84 & 1) * auVar97._0_4_ |
                        (uint)!(bool)(bVar84 & 1) * auVar32._0_4_);
        bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
        fVar149 = (float)((uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * auVar32._4_4_);
        bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
        fVar151 = (float)((uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * auVar32._8_4_);
        bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
        fVar154 = (float)((uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * auVar32._12_4_);
        auVar119 = ZEXT1632(CONCAT412(fVar154,CONCAT48(fVar151,CONCAT44(fVar149,fVar95))));
        fVar96 = (float)((uint)(bVar84 & 1) * auVar98._0_4_ |
                        (uint)!(bool)(bVar84 & 1) * auVar33._0_4_);
        bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
        fVar150 = (float)((uint)bVar13 * auVar98._4_4_ | (uint)!bVar13 * auVar33._4_4_);
        bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
        fVar152 = (float)((uint)bVar13 * auVar98._8_4_ | (uint)!bVar13 * auVar33._8_4_);
        bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
        fVar155 = (float)((uint)bVar13 * auVar98._12_4_ | (uint)!bVar13 * auVar33._12_4_);
        auVar110 = ZEXT1632(CONCAT412(fVar155,CONCAT48(fVar152,CONCAT44(fVar150,fVar96))));
        auVar115._0_4_ =
             (float)((uint)(bVar84 & 1) * auVar108._0_4_ |
                    (uint)!(bool)(bVar84 & 1) * auVar246._0_4_);
        bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * auVar246._4_4_);
        bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * auVar246._8_4_);
        bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * auVar246._12_4_);
        fVar231 = (float)((uint)((byte)(uVar85 >> 4) & 1) * auVar108._16_4_);
        auVar115._16_4_ = fVar231;
        fVar232 = (float)((uint)((byte)(uVar85 >> 5) & 1) * auVar108._20_4_);
        auVar115._20_4_ = fVar232;
        fVar187 = (float)((uint)((byte)(uVar85 >> 6) & 1) * auVar108._24_4_);
        auVar115._24_4_ = fVar187;
        iVar1 = (uint)(byte)(uVar85 >> 7) * auVar108._28_4_;
        auVar115._28_4_ = iVar1;
        auVar121 = vblendmps_avx512vl(ZEXT1632(auVar103),auVar114);
        auVar128._0_4_ =
             (uint)(bVar84 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar30._0_4_;
        bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar128._4_4_ = (uint)bVar13 * auVar121._4_4_ | (uint)!bVar13 * auVar30._4_4_;
        bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar128._8_4_ = (uint)bVar13 * auVar121._8_4_ | (uint)!bVar13 * auVar30._8_4_;
        bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar128._12_4_ = (uint)bVar13 * auVar121._12_4_ | (uint)!bVar13 * auVar30._12_4_;
        auVar128._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * auVar121._16_4_;
        auVar128._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * auVar121._20_4_;
        auVar128._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * auVar121._24_4_;
        auVar128._28_4_ = (uint)(byte)(uVar85 >> 7) * auVar121._28_4_;
        auVar121 = vblendmps_avx512vl(ZEXT1632(auVar105),ZEXT1632(auVar104));
        auVar129._0_4_ =
             (float)((uint)(bVar84 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar98._0_4_
                    );
        bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar129._4_4_ = (float)((uint)bVar13 * auVar121._4_4_ | (uint)!bVar13 * auVar98._4_4_);
        bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar129._8_4_ = (float)((uint)bVar13 * auVar121._8_4_ | (uint)!bVar13 * auVar98._8_4_);
        bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar129._12_4_ = (float)((uint)bVar13 * auVar121._12_4_ | (uint)!bVar13 * auVar98._12_4_);
        fVar179 = (float)((uint)((byte)(uVar85 >> 4) & 1) * auVar121._16_4_);
        auVar129._16_4_ = fVar179;
        fVar186 = (float)((uint)((byte)(uVar85 >> 5) & 1) * auVar121._20_4_);
        auVar129._20_4_ = fVar186;
        fVar199 = (float)((uint)((byte)(uVar85 >> 6) & 1) * auVar121._24_4_);
        auVar129._24_4_ = fVar199;
        auVar129._28_4_ = (uint)(byte)(uVar85 >> 7) * auVar121._28_4_;
        auVar121 = vblendmps_avx512vl(auVar123,ZEXT1632(auVar29));
        auVar130._0_4_ =
             (float)((uint)(bVar84 & 1) * auVar121._0_4_ |
                    (uint)!(bool)(bVar84 & 1) * auVar108._0_4_);
        bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar130._4_4_ = (float)((uint)bVar13 * auVar121._4_4_ | (uint)!bVar13 * auVar108._4_4_);
        bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar130._8_4_ = (float)((uint)bVar13 * auVar121._8_4_ | (uint)!bVar13 * auVar108._8_4_);
        bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar130._12_4_ = (float)((uint)bVar13 * auVar121._12_4_ | (uint)!bVar13 * auVar108._12_4_);
        bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar130._16_4_ = (float)((uint)bVar13 * auVar121._16_4_ | (uint)!bVar13 * auVar108._16_4_);
        bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar130._20_4_ = (float)((uint)bVar13 * auVar121._20_4_ | (uint)!bVar13 * auVar108._20_4_);
        bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar130._24_4_ = (float)((uint)bVar13 * auVar121._24_4_ | (uint)!bVar13 * auVar108._24_4_);
        bVar13 = SUB81(uVar85 >> 7,0);
        auVar130._28_4_ = (uint)bVar13 * auVar121._28_4_ | (uint)!bVar13 * auVar108._28_4_;
        auVar131._0_4_ =
             (uint)(bVar84 & 1) * (int)auVar103._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar114._0_4_;
        bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar131._4_4_ = (uint)bVar13 * (int)auVar103._4_4_ | (uint)!bVar13 * auVar114._4_4_;
        bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar131._8_4_ = (uint)bVar13 * (int)auVar103._8_4_ | (uint)!bVar13 * auVar114._8_4_;
        bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar131._12_4_ = (uint)bVar13 * (int)auVar103._12_4_ | (uint)!bVar13 * auVar114._12_4_;
        auVar131._16_4_ = (uint)!(bool)((byte)(uVar85 >> 4) & 1) * auVar114._16_4_;
        auVar131._20_4_ = (uint)!(bool)((byte)(uVar85 >> 5) & 1) * auVar114._20_4_;
        auVar131._24_4_ = (uint)!(bool)((byte)(uVar85 >> 6) & 1) * auVar114._24_4_;
        auVar131._28_4_ = (uint)!SUB81(uVar85 >> 7,0) * auVar114._28_4_;
        bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar132._0_4_ =
             (uint)(bVar84 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar29._0_4_;
        bVar14 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar132._4_4_ = (uint)bVar14 * auVar123._4_4_ | (uint)!bVar14 * auVar29._4_4_;
        bVar14 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar132._8_4_ = (uint)bVar14 * auVar123._8_4_ | (uint)!bVar14 * auVar29._8_4_;
        bVar14 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar132._12_4_ = (uint)bVar14 * auVar123._12_4_ | (uint)!bVar14 * auVar29._12_4_;
        auVar132._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * auVar123._16_4_;
        auVar132._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * auVar123._20_4_;
        auVar132._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * auVar123._24_4_;
        iVar2 = (uint)(byte)(uVar85 >> 7) * auVar123._28_4_;
        auVar132._28_4_ = iVar2;
        auVar113 = vsubps_avx512vl(auVar131,auVar119);
        auVar123 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar105._12_4_ |
                                                 (uint)!bVar16 * auVar104._12_4_,
                                                 CONCAT48((uint)bVar15 * (int)auVar105._8_4_ |
                                                          (uint)!bVar15 * auVar104._8_4_,
                                                          CONCAT44((uint)bVar13 *
                                                                   (int)auVar105._4_4_ |
                                                                   (uint)!bVar13 * auVar104._4_4_,
                                                                   (uint)(bVar84 & 1) *
                                                                   (int)auVar105._0_4_ |
                                                                   (uint)!(bool)(bVar84 & 1) *
                                                                   auVar104._0_4_)))),auVar110);
        auVar224 = ZEXT3264(auVar123);
        auVar121 = vsubps_avx(auVar132,auVar115);
        auVar120 = vsubps_avx(auVar119,auVar128);
        auVar229 = ZEXT3264(auVar120);
        auVar108 = vsubps_avx(auVar110,auVar129);
        auVar109 = vsubps_avx(auVar115,auVar130);
        auVar111._4_4_ = auVar121._4_4_ * fVar149;
        auVar111._0_4_ = auVar121._0_4_ * fVar95;
        auVar111._8_4_ = auVar121._8_4_ * fVar151;
        auVar111._12_4_ = auVar121._12_4_ * fVar154;
        auVar111._16_4_ = auVar121._16_4_ * 0.0;
        auVar111._20_4_ = auVar121._20_4_ * 0.0;
        auVar111._24_4_ = auVar121._24_4_ * 0.0;
        auVar111._28_4_ = iVar2;
        auVar97 = vfmsub231ps_fma(auVar111,auVar115,auVar113);
        auVar112._4_4_ = fVar150 * auVar113._4_4_;
        auVar112._0_4_ = fVar96 * auVar113._0_4_;
        auVar112._8_4_ = fVar152 * auVar113._8_4_;
        auVar112._12_4_ = fVar155 * auVar113._12_4_;
        auVar112._16_4_ = auVar113._16_4_ * 0.0;
        auVar112._20_4_ = auVar113._20_4_ * 0.0;
        auVar112._24_4_ = auVar113._24_4_ * 0.0;
        auVar112._28_4_ = auVar122._28_4_;
        auVar98 = vfmsub231ps_fma(auVar112,auVar119,auVar123);
        auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar98),auVar117,ZEXT1632(auVar97));
        auVar212._0_4_ = auVar123._0_4_ * auVar115._0_4_;
        auVar212._4_4_ = auVar123._4_4_ * auVar115._4_4_;
        auVar212._8_4_ = auVar123._8_4_ * auVar115._8_4_;
        auVar212._12_4_ = auVar123._12_4_ * auVar115._12_4_;
        auVar212._16_4_ = auVar123._16_4_ * fVar231;
        auVar212._20_4_ = auVar123._20_4_ * fVar232;
        auVar212._24_4_ = auVar123._24_4_ * fVar187;
        auVar212._28_4_ = 0;
        auVar97 = vfmsub231ps_fma(auVar212,auVar110,auVar121);
        auVar111 = vfmadd231ps_avx512vl(auVar122,auVar117,ZEXT1632(auVar97));
        auVar122 = vmulps_avx512vl(auVar109,auVar128);
        auVar122 = vfmsub231ps_avx512vl(auVar122,auVar120,auVar130);
        auVar114._4_4_ = auVar108._4_4_ * auVar130._4_4_;
        auVar114._0_4_ = auVar108._0_4_ * auVar130._0_4_;
        auVar114._8_4_ = auVar108._8_4_ * auVar130._8_4_;
        auVar114._12_4_ = auVar108._12_4_ * auVar130._12_4_;
        auVar114._16_4_ = auVar108._16_4_ * auVar130._16_4_;
        auVar114._20_4_ = auVar108._20_4_ * auVar130._20_4_;
        auVar114._24_4_ = auVar108._24_4_ * auVar130._24_4_;
        auVar114._28_4_ = auVar130._28_4_;
        auVar97 = vfmsub231ps_fma(auVar114,auVar129,auVar109);
        auVar213._0_4_ = auVar129._0_4_ * auVar120._0_4_;
        auVar213._4_4_ = auVar129._4_4_ * auVar120._4_4_;
        auVar213._8_4_ = auVar129._8_4_ * auVar120._8_4_;
        auVar213._12_4_ = auVar129._12_4_ * auVar120._12_4_;
        auVar213._16_4_ = fVar179 * auVar120._16_4_;
        auVar213._20_4_ = fVar186 * auVar120._20_4_;
        auVar213._24_4_ = fVar199 * auVar120._24_4_;
        auVar213._28_4_ = 0;
        auVar98 = vfmsub231ps_fma(auVar213,auVar108,auVar128);
        auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar98),auVar117,auVar122);
        auVar112 = vfmadd231ps_avx512vl(auVar122,auVar117,ZEXT1632(auVar97));
        auVar216 = ZEXT3264(auVar112);
        auVar122 = vmaxps_avx(auVar111,auVar112);
        uVar180 = vcmpps_avx512vl(auVar122,auVar117,2);
        bVar93 = bVar93 & (byte)uVar180;
        if (bVar93 != 0) {
          uVar159 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar242._4_4_ = uVar159;
          auVar242._0_4_ = uVar159;
          auVar242._8_4_ = uVar159;
          auVar242._12_4_ = uVar159;
          auVar242._16_4_ = uVar159;
          auVar242._20_4_ = uVar159;
          auVar242._24_4_ = uVar159;
          auVar242._28_4_ = uVar159;
          auVar245 = ZEXT3264(auVar242);
          auVar44._4_4_ = auVar109._4_4_ * auVar123._4_4_;
          auVar44._0_4_ = auVar109._0_4_ * auVar123._0_4_;
          auVar44._8_4_ = auVar109._8_4_ * auVar123._8_4_;
          auVar44._12_4_ = auVar109._12_4_ * auVar123._12_4_;
          auVar44._16_4_ = auVar109._16_4_ * auVar123._16_4_;
          auVar44._20_4_ = auVar109._20_4_ * auVar123._20_4_;
          auVar44._24_4_ = auVar109._24_4_ * auVar123._24_4_;
          auVar44._28_4_ = auVar122._28_4_;
          auVar29 = vfmsub231ps_fma(auVar44,auVar108,auVar121);
          auVar45._4_4_ = auVar121._4_4_ * auVar120._4_4_;
          auVar45._0_4_ = auVar121._0_4_ * auVar120._0_4_;
          auVar45._8_4_ = auVar121._8_4_ * auVar120._8_4_;
          auVar45._12_4_ = auVar121._12_4_ * auVar120._12_4_;
          auVar45._16_4_ = auVar121._16_4_ * auVar120._16_4_;
          auVar45._20_4_ = auVar121._20_4_ * auVar120._20_4_;
          auVar45._24_4_ = auVar121._24_4_ * auVar120._24_4_;
          auVar45._28_4_ = auVar121._28_4_;
          auVar104 = vfmsub231ps_fma(auVar45,auVar113,auVar109);
          auVar46._4_4_ = auVar108._4_4_ * auVar113._4_4_;
          auVar46._0_4_ = auVar108._0_4_ * auVar113._0_4_;
          auVar46._8_4_ = auVar108._8_4_ * auVar113._8_4_;
          auVar46._12_4_ = auVar108._12_4_ * auVar113._12_4_;
          auVar46._16_4_ = auVar108._16_4_ * auVar113._16_4_;
          auVar46._20_4_ = auVar108._20_4_ * auVar113._20_4_;
          auVar46._24_4_ = auVar108._24_4_ * auVar113._24_4_;
          auVar46._28_4_ = auVar108._28_4_;
          auVar30 = vfmsub231ps_fma(auVar46,auVar120,auVar123);
          auVar97 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar104),ZEXT1632(auVar30));
          auVar98 = vfmadd231ps_fma(ZEXT1632(auVar97),ZEXT1632(auVar29),ZEXT1232(ZEXT412(0)) << 0x20
                                   );
          auVar122 = vrcp14ps_avx512vl(ZEXT1632(auVar98));
          auVar39._8_4_ = 0x3f800000;
          auVar39._0_8_ = 0x3f8000003f800000;
          auVar39._12_4_ = 0x3f800000;
          auVar39._16_4_ = 0x3f800000;
          auVar39._20_4_ = 0x3f800000;
          auVar39._24_4_ = 0x3f800000;
          auVar39._28_4_ = 0x3f800000;
          auVar123 = vfnmadd213ps_avx512vl(auVar122,ZEXT1632(auVar98),auVar39);
          auVar97 = vfmadd132ps_fma(auVar123,auVar122,auVar122);
          auVar224 = ZEXT1664(auVar97);
          auVar47._4_4_ = auVar30._4_4_ * auVar115._4_4_;
          auVar47._0_4_ = auVar30._0_4_ * auVar115._0_4_;
          auVar47._8_4_ = auVar30._8_4_ * auVar115._8_4_;
          auVar47._12_4_ = auVar30._12_4_ * auVar115._12_4_;
          auVar47._16_4_ = fVar231 * 0.0;
          auVar47._20_4_ = fVar232 * 0.0;
          auVar47._24_4_ = fVar187 * 0.0;
          auVar47._28_4_ = iVar1;
          auVar104 = vfmadd231ps_fma(auVar47,auVar110,ZEXT1632(auVar104));
          auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar119,ZEXT1632(auVar29));
          fVar187 = auVar97._0_4_;
          fVar231 = auVar97._4_4_;
          fVar232 = auVar97._8_4_;
          fVar179 = auVar97._12_4_;
          local_800._28_4_ = auVar122._28_4_;
          local_800._0_28_ =
               ZEXT1628(CONCAT412(auVar104._12_4_ * fVar179,
                                  CONCAT48(auVar104._8_4_ * fVar232,
                                           CONCAT44(auVar104._4_4_ * fVar231,
                                                    auVar104._0_4_ * fVar187))));
          auVar229 = ZEXT3264(local_800);
          auVar167._4_4_ = local_7a0;
          auVar167._0_4_ = local_7a0;
          auVar167._8_4_ = local_7a0;
          auVar167._12_4_ = local_7a0;
          auVar167._16_4_ = local_7a0;
          auVar167._20_4_ = local_7a0;
          auVar167._24_4_ = local_7a0;
          auVar167._28_4_ = local_7a0;
          uVar180 = vcmpps_avx512vl(local_800,auVar242,2);
          uVar35 = vcmpps_avx512vl(auVar167,local_800,2);
          bVar93 = (byte)uVar180 & (byte)uVar35 & bVar93;
          if (bVar93 != 0) {
            uVar94 = vcmpps_avx512vl(ZEXT1632(auVar98),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar94 = bVar93 & uVar94;
            if ((char)uVar94 != '\0') {
              fVar186 = auVar111._0_4_ * fVar187;
              fVar199 = auVar111._4_4_ * fVar231;
              auVar48._4_4_ = fVar199;
              auVar48._0_4_ = fVar186;
              fVar95 = auVar111._8_4_ * fVar232;
              auVar48._8_4_ = fVar95;
              fVar96 = auVar111._12_4_ * fVar179;
              auVar48._12_4_ = fVar96;
              fVar149 = auVar111._16_4_ * 0.0;
              auVar48._16_4_ = fVar149;
              fVar150 = auVar111._20_4_ * 0.0;
              auVar48._20_4_ = fVar150;
              fVar151 = auVar111._24_4_ * 0.0;
              auVar48._24_4_ = fVar151;
              auVar48._28_4_ = auVar111._28_4_;
              auVar168._8_4_ = 0x3f800000;
              auVar168._0_8_ = 0x3f8000003f800000;
              auVar168._12_4_ = 0x3f800000;
              auVar168._16_4_ = 0x3f800000;
              auVar168._20_4_ = 0x3f800000;
              auVar168._24_4_ = 0x3f800000;
              auVar168._28_4_ = 0x3f800000;
              auVar122 = vsubps_avx(auVar168,auVar48);
              local_640._0_4_ =
                   (float)((uint)(bVar84 & 1) * (int)fVar186 |
                          (uint)!(bool)(bVar84 & 1) * auVar122._0_4_);
              bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
              local_640._4_4_ =
                   (float)((uint)bVar13 * (int)fVar199 | (uint)!bVar13 * auVar122._4_4_);
              bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
              local_640._8_4_ = (float)((uint)bVar13 * (int)fVar95 | (uint)!bVar13 * auVar122._8_4_)
              ;
              bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
              local_640._12_4_ =
                   (float)((uint)bVar13 * (int)fVar96 | (uint)!bVar13 * auVar122._12_4_);
              bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
              local_640._16_4_ =
                   (float)((uint)bVar13 * (int)fVar149 | (uint)!bVar13 * auVar122._16_4_);
              bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
              local_640._20_4_ =
                   (float)((uint)bVar13 * (int)fVar150 | (uint)!bVar13 * auVar122._20_4_);
              bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
              local_640._24_4_ =
                   (float)((uint)bVar13 * (int)fVar151 | (uint)!bVar13 * auVar122._24_4_);
              bVar13 = SUB81(uVar85 >> 7,0);
              local_640._28_4_ =
                   (float)((uint)bVar13 * auVar111._28_4_ | (uint)!bVar13 * auVar122._28_4_);
              auVar122 = vsubps_avx(ZEXT1632(auVar34),auVar116);
              auVar97 = vfmadd213ps_fma(auVar122,local_640,auVar116);
              uVar159 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar116._4_4_ = uVar159;
              auVar116._0_4_ = uVar159;
              auVar116._8_4_ = uVar159;
              auVar116._12_4_ = uVar159;
              auVar116._16_4_ = uVar159;
              auVar116._20_4_ = uVar159;
              auVar116._24_4_ = uVar159;
              auVar116._28_4_ = uVar159;
              auVar122 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar97._12_4_ + auVar97._12_4_,
                                                            CONCAT48(auVar97._8_4_ + auVar97._8_4_,
                                                                     CONCAT44(auVar97._4_4_ +
                                                                              auVar97._4_4_,
                                                                              auVar97._0_4_ +
                                                                              auVar97._0_4_)))),
                                         auVar116);
              uVar36 = vcmpps_avx512vl(local_800,auVar122,6);
              uVar94 = uVar94 & uVar36;
              bVar93 = (byte)uVar94;
              if (bVar93 != 0) {
                auVar197._0_4_ = auVar112._0_4_ * fVar187;
                auVar197._4_4_ = auVar112._4_4_ * fVar231;
                auVar197._8_4_ = auVar112._8_4_ * fVar232;
                auVar197._12_4_ = auVar112._12_4_ * fVar179;
                auVar197._16_4_ = auVar112._16_4_ * 0.0;
                auVar197._20_4_ = auVar112._20_4_ * 0.0;
                auVar197._24_4_ = auVar112._24_4_ * 0.0;
                auVar197._28_4_ = 0;
                auVar207._8_4_ = 0x3f800000;
                auVar207._0_8_ = 0x3f8000003f800000;
                auVar207._12_4_ = 0x3f800000;
                auVar207._16_4_ = 0x3f800000;
                auVar207._20_4_ = 0x3f800000;
                auVar207._24_4_ = 0x3f800000;
                auVar207._28_4_ = 0x3f800000;
                auVar122 = vsubps_avx(auVar207,auVar197);
                auVar133._0_4_ =
                     (uint)(bVar84 & 1) * (int)auVar197._0_4_ |
                     (uint)!(bool)(bVar84 & 1) * auVar122._0_4_;
                bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                auVar133._4_4_ = (uint)bVar13 * (int)auVar197._4_4_ | (uint)!bVar13 * auVar122._4_4_
                ;
                bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
                auVar133._8_4_ = (uint)bVar13 * (int)auVar197._8_4_ | (uint)!bVar13 * auVar122._8_4_
                ;
                bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
                auVar133._12_4_ =
                     (uint)bVar13 * (int)auVar197._12_4_ | (uint)!bVar13 * auVar122._12_4_;
                bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
                auVar133._16_4_ =
                     (uint)bVar13 * (int)auVar197._16_4_ | (uint)!bVar13 * auVar122._16_4_;
                bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
                auVar133._20_4_ =
                     (uint)bVar13 * (int)auVar197._20_4_ | (uint)!bVar13 * auVar122._20_4_;
                bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
                auVar133._24_4_ =
                     (uint)bVar13 * (int)auVar197._24_4_ | (uint)!bVar13 * auVar122._24_4_;
                auVar133._28_4_ = (uint)!SUB81(uVar85 >> 7,0) * auVar122._28_4_;
                auVar40._8_4_ = 0x40000000;
                auVar40._0_8_ = 0x4000000040000000;
                auVar40._12_4_ = 0x40000000;
                auVar40._16_4_ = 0x40000000;
                auVar40._20_4_ = 0x40000000;
                auVar40._24_4_ = 0x40000000;
                auVar40._28_4_ = 0x40000000;
                local_620 = vfmsub132ps_avx512vl(auVar133,auVar207,auVar40);
                local_5e0 = 0;
                local_5d0 = local_860;
                uStack_5c8 = uStack_858;
                local_5c0 = local_870;
                uStack_5b8 = uStack_868;
                local_5b0 = local_880;
                uStack_5a8 = uStack_878;
                local_5a0 = local_890;
                uStack_598 = uStack_888;
                if ((pGVar90->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  fVar187 = 1.0 / auVar118._0_4_;
                  local_580[0] = fVar187 * (local_640._0_4_ + 0.0);
                  local_580[1] = fVar187 * (local_640._4_4_ + 1.0);
                  local_580[2] = fVar187 * (local_640._8_4_ + 2.0);
                  local_580[3] = fVar187 * (local_640._12_4_ + 3.0);
                  fStack_570 = fVar187 * (local_640._16_4_ + 4.0);
                  fStack_56c = fVar187 * (local_640._20_4_ + 5.0);
                  fStack_568 = fVar187 * (local_640._24_4_ + 6.0);
                  fStack_564 = local_640._28_4_ + 7.0;
                  local_560 = local_620;
                  local_540 = local_800;
                  auVar169._8_4_ = 0x7f800000;
                  auVar169._0_8_ = 0x7f8000007f800000;
                  auVar169._12_4_ = 0x7f800000;
                  auVar169._16_4_ = 0x7f800000;
                  auVar169._20_4_ = 0x7f800000;
                  auVar169._24_4_ = 0x7f800000;
                  auVar169._28_4_ = 0x7f800000;
                  auVar122 = vblendmps_avx512vl(auVar169,local_800);
                  auVar134._0_4_ =
                       (uint)(bVar93 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar93 & 1) * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar94 >> 1) & 1);
                  auVar134._4_4_ = (uint)bVar13 * auVar122._4_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar94 >> 2) & 1);
                  auVar134._8_4_ = (uint)bVar13 * auVar122._8_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar94 >> 3) & 1);
                  auVar134._12_4_ = (uint)bVar13 * auVar122._12_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar94 >> 4) & 1);
                  auVar134._16_4_ = (uint)bVar13 * auVar122._16_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar94 >> 5) & 1);
                  auVar134._20_4_ = (uint)bVar13 * auVar122._20_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar94 >> 6) & 1);
                  auVar134._24_4_ = (uint)bVar13 * auVar122._24_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = SUB81(uVar94 >> 7,0);
                  auVar134._28_4_ = (uint)bVar13 * auVar122._28_4_ | (uint)!bVar13 * 0x7f800000;
                  auVar122 = vshufps_avx(auVar134,auVar134,0xb1);
                  auVar122 = vminps_avx(auVar134,auVar122);
                  auVar123 = vshufpd_avx(auVar122,auVar122,5);
                  auVar122 = vminps_avx(auVar122,auVar123);
                  auVar123 = vpermpd_avx2(auVar122,0x4e);
                  auVar122 = vminps_avx(auVar122,auVar123);
                  uVar180 = vcmpps_avx512vl(auVar134,auVar122,0);
                  uVar86 = (uint)uVar94;
                  if (((byte)uVar180 & bVar93) != 0) {
                    uVar86 = (uint)((byte)uVar180 & bVar93);
                  }
                  uVar87 = 0;
                  for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x80000000) {
                    uVar87 = uVar87 + 1;
                  }
                  uVar85 = (ulong)uVar87;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar90->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar216 = vpbroadcastd_avx512f();
                    local_400 = vmovdqa64_avx512f(auVar216);
                    auVar216 = vpbroadcastd_avx512f();
                    local_440 = vmovdqa64_avx512f(auVar216);
                    local_600 = local_800;
                    local_5dc = iVar8;
                    do {
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_580[uVar85]));
                      local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_560 + uVar85 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_540 + uVar85 * 4)
                      ;
                      local_848.context = context->user;
                      fVar179 = local_200._0_4_;
                      fVar231 = 1.0 - fVar179;
                      fVar187 = fVar231 * fVar231 * -3.0;
                      auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar231 * fVar231)),
                                                ZEXT416((uint)(fVar179 * fVar231)),
                                                ZEXT416(0xc0000000));
                      auVar98 = vfmsub132ss_fma(ZEXT416((uint)(fVar179 * fVar231)),
                                                ZEXT416((uint)(fVar179 * fVar179)),
                                                ZEXT416(0x40000000));
                      fVar231 = auVar97._0_4_ * 3.0;
                      fVar232 = auVar98._0_4_ * 3.0;
                      fVar179 = fVar179 * fVar179 * 3.0;
                      auVar223._0_4_ = fVar179 * fVar158;
                      auVar223._4_4_ = fVar179 * fVar176;
                      auVar223._8_4_ = fVar179 * fVar177;
                      auVar223._12_4_ = fVar179 * fVar178;
                      auVar165._4_4_ = fVar232;
                      auVar165._0_4_ = fVar232;
                      auVar165._8_4_ = fVar232;
                      auVar165._12_4_ = fVar232;
                      auVar97 = vfmadd132ps_fma(auVar165,auVar223,auVar102);
                      auVar206._4_4_ = fVar231;
                      auVar206._0_4_ = fVar231;
                      auVar206._8_4_ = fVar231;
                      auVar206._12_4_ = fVar231;
                      auVar97 = vfmadd132ps_fma(auVar206,auVar97,auVar28);
                      auVar166._4_4_ = fVar187;
                      auVar166._0_4_ = fVar187;
                      auVar166._8_4_ = fVar187;
                      auVar166._12_4_ = fVar187;
                      auVar97 = vfmadd132ps_fma(auVar166,auVar97,auVar27);
                      auVar148 = vbroadcastss_avx512f(auVar97);
                      auVar216 = vbroadcastss_avx512f(ZEXT416(1));
                      auVar216 = vpermps_avx512f(auVar216,ZEXT1664(auVar97));
                      auVar224 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar224,ZEXT1664(auVar97));
                      local_2c0[0] = (RTCHitN)auVar148[0];
                      local_2c0[1] = (RTCHitN)auVar148[1];
                      local_2c0[2] = (RTCHitN)auVar148[2];
                      local_2c0[3] = (RTCHitN)auVar148[3];
                      local_2c0[4] = (RTCHitN)auVar148[4];
                      local_2c0[5] = (RTCHitN)auVar148[5];
                      local_2c0[6] = (RTCHitN)auVar148[6];
                      local_2c0[7] = (RTCHitN)auVar148[7];
                      local_2c0[8] = (RTCHitN)auVar148[8];
                      local_2c0[9] = (RTCHitN)auVar148[9];
                      local_2c0[10] = (RTCHitN)auVar148[10];
                      local_2c0[0xb] = (RTCHitN)auVar148[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar148[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar148[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar148[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar148[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar148[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar148[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar148[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar148[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar148[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar148[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar148[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar148[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar148[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar148[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar148[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar148[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar148[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar148[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar148[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar148[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar148[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar148[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar148[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar148[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar148[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar148[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar148[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar148[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar148[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar148[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar148[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar148[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar148[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar148[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar148[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar148[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar148[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar148[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar148[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar148[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar148[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar148[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar148[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar148[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar148[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar148[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar148[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar148[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar148[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar148[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar148[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar148[0x3f];
                      local_280 = auVar216;
                      local_180 = local_440._0_8_;
                      uStack_178 = local_440._8_8_;
                      uStack_170 = local_440._16_8_;
                      uStack_168 = local_440._24_8_;
                      uStack_160 = local_440._32_8_;
                      uStack_158 = local_440._40_8_;
                      uStack_150 = local_440._48_8_;
                      uStack_148 = local_440._56_8_;
                      auVar148 = vmovdqa64_avx512f(local_400);
                      local_140 = vmovdqa64_avx512f(auVar148);
                      auVar122 = vpcmpeqd_avx2(auVar148._0_32_,auVar148._0_32_);
                      local_810[3] = auVar122;
                      local_810[2] = auVar122;
                      local_810[1] = auVar122;
                      *local_810 = auVar122;
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_848.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_848.context)->instPrimID[0]));
                      auVar148 = vmovdqa64_avx512f(local_300);
                      local_780 = vmovdqa64_avx512f(auVar148);
                      local_848.valid = (int *)local_780;
                      local_848.geometryUserPtr = pGVar90->userPtr;
                      local_848.hit = local_2c0;
                      local_848.N = 0x10;
                      local_7c0 = auVar245._0_32_;
                      local_848.ray = (RTCRayN *)ray;
                      if (pGVar90->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar216 = ZEXT1664(auVar216._0_16_);
                        auVar224 = ZEXT1664(auVar224._0_16_);
                        (*pGVar90->intersectionFilterN)(&local_848);
                        auVar229 = ZEXT3264(local_800);
                        auVar245 = ZEXT3264(local_7c0);
                        auVar175 = ZEXT464(0xbf800000);
                        auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar247 = ZEXT1664(auVar97);
                        auVar148 = vmovdqa64_avx512f(local_780);
                      }
                      uVar180 = vptestmd_avx512f(auVar148,auVar148);
                      if ((short)uVar180 == 0) {
LAB_01b84e29:
                        *(int *)(ray + k * 4 + 0x200) = auVar245._0_4_;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar90->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar216 = ZEXT1664(auVar216._0_16_);
                          auVar224 = ZEXT1664(auVar224._0_16_);
                          (*p_Var12)(&local_848);
                          auVar229 = ZEXT3264(local_800);
                          auVar245 = ZEXT3264(local_7c0);
                          auVar175 = ZEXT464(0xbf800000);
                          auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar247 = ZEXT1664(auVar97);
                          auVar148 = vmovdqa64_avx512f(local_780);
                        }
                        uVar36 = vptestmd_avx512f(auVar148,auVar148);
                        if ((short)uVar36 == 0) goto LAB_01b84e29;
                        iVar1 = *(int *)(local_848.hit + 4);
                        iVar2 = *(int *)(local_848.hit + 8);
                        iVar69 = *(int *)(local_848.hit + 0xc);
                        iVar70 = *(int *)(local_848.hit + 0x10);
                        iVar71 = *(int *)(local_848.hit + 0x14);
                        iVar72 = *(int *)(local_848.hit + 0x18);
                        iVar73 = *(int *)(local_848.hit + 0x1c);
                        iVar74 = *(int *)(local_848.hit + 0x20);
                        iVar75 = *(int *)(local_848.hit + 0x24);
                        iVar76 = *(int *)(local_848.hit + 0x28);
                        iVar77 = *(int *)(local_848.hit + 0x2c);
                        iVar78 = *(int *)(local_848.hit + 0x30);
                        iVar79 = *(int *)(local_848.hit + 0x34);
                        iVar80 = *(int *)(local_848.hit + 0x38);
                        iVar81 = *(int *)(local_848.hit + 0x3c);
                        bVar93 = (byte)uVar36;
                        bVar13 = (bool)((byte)(uVar36 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar36 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar36 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar36 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar36 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar36 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar36 >> 7) & 1);
                        bVar84 = (byte)(uVar36 >> 8);
                        bVar20 = (bool)((byte)(uVar36 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar36 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar36 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar36 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar36 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar36 >> 0xe) & 1);
                        bVar26 = SUB81(uVar36 >> 0xf,0);
                        *(uint *)(local_848.ray + 0x300) =
                             (uint)(bVar93 & 1) * *(int *)local_848.hit |
                             (uint)!(bool)(bVar93 & 1) * *(int *)(local_848.ray + 0x300);
                        *(uint *)(local_848.ray + 0x304) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_848.ray + 0x304);
                        *(uint *)(local_848.ray + 0x308) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_848.ray + 0x308);
                        *(uint *)(local_848.ray + 0x30c) =
                             (uint)bVar15 * iVar69 | (uint)!bVar15 * *(int *)(local_848.ray + 0x30c)
                        ;
                        *(uint *)(local_848.ray + 0x310) =
                             (uint)bVar16 * iVar70 | (uint)!bVar16 * *(int *)(local_848.ray + 0x310)
                        ;
                        *(uint *)(local_848.ray + 0x314) =
                             (uint)bVar17 * iVar71 | (uint)!bVar17 * *(int *)(local_848.ray + 0x314)
                        ;
                        *(uint *)(local_848.ray + 0x318) =
                             (uint)bVar18 * iVar72 | (uint)!bVar18 * *(int *)(local_848.ray + 0x318)
                        ;
                        *(uint *)(local_848.ray + 0x31c) =
                             (uint)bVar19 * iVar73 | (uint)!bVar19 * *(int *)(local_848.ray + 0x31c)
                        ;
                        *(uint *)(local_848.ray + 800) =
                             (uint)(bVar84 & 1) * iVar74 |
                             (uint)!(bool)(bVar84 & 1) * *(int *)(local_848.ray + 800);
                        *(uint *)(local_848.ray + 0x324) =
                             (uint)bVar20 * iVar75 | (uint)!bVar20 * *(int *)(local_848.ray + 0x324)
                        ;
                        *(uint *)(local_848.ray + 0x328) =
                             (uint)bVar21 * iVar76 | (uint)!bVar21 * *(int *)(local_848.ray + 0x328)
                        ;
                        *(uint *)(local_848.ray + 0x32c) =
                             (uint)bVar22 * iVar77 | (uint)!bVar22 * *(int *)(local_848.ray + 0x32c)
                        ;
                        *(uint *)(local_848.ray + 0x330) =
                             (uint)bVar23 * iVar78 | (uint)!bVar23 * *(int *)(local_848.ray + 0x330)
                        ;
                        *(uint *)(local_848.ray + 0x334) =
                             (uint)bVar24 * iVar79 | (uint)!bVar24 * *(int *)(local_848.ray + 0x334)
                        ;
                        *(uint *)(local_848.ray + 0x338) =
                             (uint)bVar25 * iVar80 | (uint)!bVar25 * *(int *)(local_848.ray + 0x338)
                        ;
                        *(uint *)(local_848.ray + 0x33c) =
                             (uint)bVar26 * iVar81 | (uint)!bVar26 * *(int *)(local_848.ray + 0x33c)
                        ;
                        iVar1 = *(int *)(local_848.hit + 0x44);
                        iVar2 = *(int *)(local_848.hit + 0x48);
                        iVar69 = *(int *)(local_848.hit + 0x4c);
                        iVar70 = *(int *)(local_848.hit + 0x50);
                        iVar71 = *(int *)(local_848.hit + 0x54);
                        iVar72 = *(int *)(local_848.hit + 0x58);
                        iVar73 = *(int *)(local_848.hit + 0x5c);
                        iVar74 = *(int *)(local_848.hit + 0x60);
                        iVar75 = *(int *)(local_848.hit + 100);
                        iVar76 = *(int *)(local_848.hit + 0x68);
                        iVar77 = *(int *)(local_848.hit + 0x6c);
                        iVar78 = *(int *)(local_848.hit + 0x70);
                        iVar79 = *(int *)(local_848.hit + 0x74);
                        iVar80 = *(int *)(local_848.hit + 0x78);
                        iVar81 = *(int *)(local_848.hit + 0x7c);
                        bVar13 = (bool)((byte)(uVar36 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar36 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar36 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar36 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar36 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar36 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar36 >> 7) & 1);
                        bVar20 = (bool)((byte)(uVar36 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar36 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar36 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar36 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar36 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar36 >> 0xe) & 1);
                        bVar26 = SUB81(uVar36 >> 0xf,0);
                        *(uint *)(local_848.ray + 0x340) =
                             (uint)(bVar93 & 1) * *(int *)(local_848.hit + 0x40) |
                             (uint)!(bool)(bVar93 & 1) * *(int *)(local_848.ray + 0x340);
                        *(uint *)(local_848.ray + 0x344) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_848.ray + 0x344);
                        *(uint *)(local_848.ray + 0x348) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_848.ray + 0x348);
                        *(uint *)(local_848.ray + 0x34c) =
                             (uint)bVar15 * iVar69 | (uint)!bVar15 * *(int *)(local_848.ray + 0x34c)
                        ;
                        *(uint *)(local_848.ray + 0x350) =
                             (uint)bVar16 * iVar70 | (uint)!bVar16 * *(int *)(local_848.ray + 0x350)
                        ;
                        *(uint *)(local_848.ray + 0x354) =
                             (uint)bVar17 * iVar71 | (uint)!bVar17 * *(int *)(local_848.ray + 0x354)
                        ;
                        *(uint *)(local_848.ray + 0x358) =
                             (uint)bVar18 * iVar72 | (uint)!bVar18 * *(int *)(local_848.ray + 0x358)
                        ;
                        *(uint *)(local_848.ray + 0x35c) =
                             (uint)bVar19 * iVar73 | (uint)!bVar19 * *(int *)(local_848.ray + 0x35c)
                        ;
                        *(uint *)(local_848.ray + 0x360) =
                             (uint)(bVar84 & 1) * iVar74 |
                             (uint)!(bool)(bVar84 & 1) * *(int *)(local_848.ray + 0x360);
                        *(uint *)(local_848.ray + 0x364) =
                             (uint)bVar20 * iVar75 | (uint)!bVar20 * *(int *)(local_848.ray + 0x364)
                        ;
                        *(uint *)(local_848.ray + 0x368) =
                             (uint)bVar21 * iVar76 | (uint)!bVar21 * *(int *)(local_848.ray + 0x368)
                        ;
                        *(uint *)(local_848.ray + 0x36c) =
                             (uint)bVar22 * iVar77 | (uint)!bVar22 * *(int *)(local_848.ray + 0x36c)
                        ;
                        *(uint *)(local_848.ray + 0x370) =
                             (uint)bVar23 * iVar78 | (uint)!bVar23 * *(int *)(local_848.ray + 0x370)
                        ;
                        *(uint *)(local_848.ray + 0x374) =
                             (uint)bVar24 * iVar79 | (uint)!bVar24 * *(int *)(local_848.ray + 0x374)
                        ;
                        *(uint *)(local_848.ray + 0x378) =
                             (uint)bVar25 * iVar80 | (uint)!bVar25 * *(int *)(local_848.ray + 0x378)
                        ;
                        *(uint *)(local_848.ray + 0x37c) =
                             (uint)bVar26 * iVar81 | (uint)!bVar26 * *(int *)(local_848.ray + 0x37c)
                        ;
                        iVar1 = *(int *)(local_848.hit + 0x84);
                        iVar2 = *(int *)(local_848.hit + 0x88);
                        iVar69 = *(int *)(local_848.hit + 0x8c);
                        iVar70 = *(int *)(local_848.hit + 0x90);
                        iVar71 = *(int *)(local_848.hit + 0x94);
                        iVar72 = *(int *)(local_848.hit + 0x98);
                        iVar73 = *(int *)(local_848.hit + 0x9c);
                        iVar74 = *(int *)(local_848.hit + 0xa0);
                        iVar75 = *(int *)(local_848.hit + 0xa4);
                        iVar76 = *(int *)(local_848.hit + 0xa8);
                        iVar77 = *(int *)(local_848.hit + 0xac);
                        iVar78 = *(int *)(local_848.hit + 0xb0);
                        iVar79 = *(int *)(local_848.hit + 0xb4);
                        iVar80 = *(int *)(local_848.hit + 0xb8);
                        iVar81 = *(int *)(local_848.hit + 0xbc);
                        bVar13 = (bool)((byte)(uVar36 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar36 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar36 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar36 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar36 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar36 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar36 >> 7) & 1);
                        bVar20 = (bool)((byte)(uVar36 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar36 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar36 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar36 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar36 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar36 >> 0xe) & 1);
                        bVar26 = SUB81(uVar36 >> 0xf,0);
                        *(uint *)(local_848.ray + 0x380) =
                             (uint)(bVar93 & 1) * *(int *)(local_848.hit + 0x80) |
                             (uint)!(bool)(bVar93 & 1) * *(int *)(local_848.ray + 0x380);
                        *(uint *)(local_848.ray + 900) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_848.ray + 900);
                        *(uint *)(local_848.ray + 0x388) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_848.ray + 0x388);
                        *(uint *)(local_848.ray + 0x38c) =
                             (uint)bVar15 * iVar69 | (uint)!bVar15 * *(int *)(local_848.ray + 0x38c)
                        ;
                        *(uint *)(local_848.ray + 0x390) =
                             (uint)bVar16 * iVar70 | (uint)!bVar16 * *(int *)(local_848.ray + 0x390)
                        ;
                        *(uint *)(local_848.ray + 0x394) =
                             (uint)bVar17 * iVar71 | (uint)!bVar17 * *(int *)(local_848.ray + 0x394)
                        ;
                        *(uint *)(local_848.ray + 0x398) =
                             (uint)bVar18 * iVar72 | (uint)!bVar18 * *(int *)(local_848.ray + 0x398)
                        ;
                        *(uint *)(local_848.ray + 0x39c) =
                             (uint)bVar19 * iVar73 | (uint)!bVar19 * *(int *)(local_848.ray + 0x39c)
                        ;
                        *(uint *)(local_848.ray + 0x3a0) =
                             (uint)(bVar84 & 1) * iVar74 |
                             (uint)!(bool)(bVar84 & 1) * *(int *)(local_848.ray + 0x3a0);
                        *(uint *)(local_848.ray + 0x3a4) =
                             (uint)bVar20 * iVar75 | (uint)!bVar20 * *(int *)(local_848.ray + 0x3a4)
                        ;
                        *(uint *)(local_848.ray + 0x3a8) =
                             (uint)bVar21 * iVar76 | (uint)!bVar21 * *(int *)(local_848.ray + 0x3a8)
                        ;
                        *(uint *)(local_848.ray + 0x3ac) =
                             (uint)bVar22 * iVar77 | (uint)!bVar22 * *(int *)(local_848.ray + 0x3ac)
                        ;
                        *(uint *)(local_848.ray + 0x3b0) =
                             (uint)bVar23 * iVar78 | (uint)!bVar23 * *(int *)(local_848.ray + 0x3b0)
                        ;
                        *(uint *)(local_848.ray + 0x3b4) =
                             (uint)bVar24 * iVar79 | (uint)!bVar24 * *(int *)(local_848.ray + 0x3b4)
                        ;
                        *(uint *)(local_848.ray + 0x3b8) =
                             (uint)bVar25 * iVar80 | (uint)!bVar25 * *(int *)(local_848.ray + 0x3b8)
                        ;
                        *(uint *)(local_848.ray + 0x3bc) =
                             (uint)bVar26 * iVar81 | (uint)!bVar26 * *(int *)(local_848.ray + 0x3bc)
                        ;
                        iVar1 = *(int *)(local_848.hit + 0xc4);
                        iVar2 = *(int *)(local_848.hit + 200);
                        iVar69 = *(int *)(local_848.hit + 0xcc);
                        iVar70 = *(int *)(local_848.hit + 0xd0);
                        iVar71 = *(int *)(local_848.hit + 0xd4);
                        iVar72 = *(int *)(local_848.hit + 0xd8);
                        iVar73 = *(int *)(local_848.hit + 0xdc);
                        iVar74 = *(int *)(local_848.hit + 0xe0);
                        iVar75 = *(int *)(local_848.hit + 0xe4);
                        iVar76 = *(int *)(local_848.hit + 0xe8);
                        iVar77 = *(int *)(local_848.hit + 0xec);
                        iVar78 = *(int *)(local_848.hit + 0xf0);
                        iVar79 = *(int *)(local_848.hit + 0xf4);
                        iVar80 = *(int *)(local_848.hit + 0xf8);
                        iVar81 = *(int *)(local_848.hit + 0xfc);
                        bVar13 = (bool)((byte)(uVar36 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar36 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar36 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar36 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar36 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar36 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar36 >> 7) & 1);
                        bVar20 = (bool)((byte)(uVar36 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar36 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar36 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar36 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar36 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar36 >> 0xe) & 1);
                        bVar26 = SUB81(uVar36 >> 0xf,0);
                        *(uint *)(local_848.ray + 0x3c0) =
                             (uint)(bVar93 & 1) * *(int *)(local_848.hit + 0xc0) |
                             (uint)!(bool)(bVar93 & 1) * *(int *)(local_848.ray + 0x3c0);
                        *(uint *)(local_848.ray + 0x3c4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_848.ray + 0x3c4);
                        *(uint *)(local_848.ray + 0x3c8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_848.ray + 0x3c8);
                        *(uint *)(local_848.ray + 0x3cc) =
                             (uint)bVar15 * iVar69 | (uint)!bVar15 * *(int *)(local_848.ray + 0x3cc)
                        ;
                        *(uint *)(local_848.ray + 0x3d0) =
                             (uint)bVar16 * iVar70 | (uint)!bVar16 * *(int *)(local_848.ray + 0x3d0)
                        ;
                        *(uint *)(local_848.ray + 0x3d4) =
                             (uint)bVar17 * iVar71 | (uint)!bVar17 * *(int *)(local_848.ray + 0x3d4)
                        ;
                        *(uint *)(local_848.ray + 0x3d8) =
                             (uint)bVar18 * iVar72 | (uint)!bVar18 * *(int *)(local_848.ray + 0x3d8)
                        ;
                        *(uint *)(local_848.ray + 0x3dc) =
                             (uint)bVar19 * iVar73 | (uint)!bVar19 * *(int *)(local_848.ray + 0x3dc)
                        ;
                        *(uint *)(local_848.ray + 0x3e0) =
                             (uint)(bVar84 & 1) * iVar74 |
                             (uint)!(bool)(bVar84 & 1) * *(int *)(local_848.ray + 0x3e0);
                        *(uint *)(local_848.ray + 0x3e4) =
                             (uint)bVar20 * iVar75 | (uint)!bVar20 * *(int *)(local_848.ray + 0x3e4)
                        ;
                        *(uint *)(local_848.ray + 1000) =
                             (uint)bVar21 * iVar76 | (uint)!bVar21 * *(int *)(local_848.ray + 1000);
                        *(uint *)(local_848.ray + 0x3ec) =
                             (uint)bVar22 * iVar77 | (uint)!bVar22 * *(int *)(local_848.ray + 0x3ec)
                        ;
                        *(uint *)(local_848.ray + 0x3f0) =
                             (uint)bVar23 * iVar78 | (uint)!bVar23 * *(int *)(local_848.ray + 0x3f0)
                        ;
                        *(uint *)(local_848.ray + 0x3f4) =
                             (uint)bVar24 * iVar79 | (uint)!bVar24 * *(int *)(local_848.ray + 0x3f4)
                        ;
                        *(uint *)(local_848.ray + 0x3f8) =
                             (uint)bVar25 * iVar80 | (uint)!bVar25 * *(int *)(local_848.ray + 0x3f8)
                        ;
                        *(uint *)(local_848.ray + 0x3fc) =
                             (uint)bVar26 * iVar81 | (uint)!bVar26 * *(int *)(local_848.ray + 0x3fc)
                        ;
                        iVar1 = *(int *)(local_848.hit + 0x104);
                        iVar2 = *(int *)(local_848.hit + 0x108);
                        iVar69 = *(int *)(local_848.hit + 0x10c);
                        iVar70 = *(int *)(local_848.hit + 0x110);
                        iVar71 = *(int *)(local_848.hit + 0x114);
                        iVar72 = *(int *)(local_848.hit + 0x118);
                        iVar73 = *(int *)(local_848.hit + 0x11c);
                        iVar74 = *(int *)(local_848.hit + 0x120);
                        iVar75 = *(int *)(local_848.hit + 0x124);
                        iVar76 = *(int *)(local_848.hit + 0x128);
                        iVar77 = *(int *)(local_848.hit + 300);
                        iVar78 = *(int *)(local_848.hit + 0x130);
                        iVar79 = *(int *)(local_848.hit + 0x134);
                        iVar80 = *(int *)(local_848.hit + 0x138);
                        iVar81 = *(int *)(local_848.hit + 0x13c);
                        bVar13 = (bool)((byte)(uVar36 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar36 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar36 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar36 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar36 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar36 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar36 >> 7) & 1);
                        bVar20 = (bool)((byte)(uVar36 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar36 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar36 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar36 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar36 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar36 >> 0xe) & 1);
                        bVar26 = SUB81(uVar36 >> 0xf,0);
                        *(uint *)(local_848.ray + 0x400) =
                             (uint)(bVar93 & 1) * *(int *)(local_848.hit + 0x100) |
                             (uint)!(bool)(bVar93 & 1) * *(int *)(local_848.ray + 0x400);
                        *(uint *)(local_848.ray + 0x404) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_848.ray + 0x404);
                        *(uint *)(local_848.ray + 0x408) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_848.ray + 0x408);
                        *(uint *)(local_848.ray + 0x40c) =
                             (uint)bVar15 * iVar69 | (uint)!bVar15 * *(int *)(local_848.ray + 0x40c)
                        ;
                        *(uint *)(local_848.ray + 0x410) =
                             (uint)bVar16 * iVar70 | (uint)!bVar16 * *(int *)(local_848.ray + 0x410)
                        ;
                        *(uint *)(local_848.ray + 0x414) =
                             (uint)bVar17 * iVar71 | (uint)!bVar17 * *(int *)(local_848.ray + 0x414)
                        ;
                        *(uint *)(local_848.ray + 0x418) =
                             (uint)bVar18 * iVar72 | (uint)!bVar18 * *(int *)(local_848.ray + 0x418)
                        ;
                        *(uint *)(local_848.ray + 0x41c) =
                             (uint)bVar19 * iVar73 | (uint)!bVar19 * *(int *)(local_848.ray + 0x41c)
                        ;
                        *(uint *)(local_848.ray + 0x420) =
                             (uint)(bVar84 & 1) * iVar74 |
                             (uint)!(bool)(bVar84 & 1) * *(int *)(local_848.ray + 0x420);
                        *(uint *)(local_848.ray + 0x424) =
                             (uint)bVar20 * iVar75 | (uint)!bVar20 * *(int *)(local_848.ray + 0x424)
                        ;
                        *(uint *)(local_848.ray + 0x428) =
                             (uint)bVar21 * iVar76 | (uint)!bVar21 * *(int *)(local_848.ray + 0x428)
                        ;
                        *(uint *)(local_848.ray + 0x42c) =
                             (uint)bVar22 * iVar77 | (uint)!bVar22 * *(int *)(local_848.ray + 0x42c)
                        ;
                        *(uint *)(local_848.ray + 0x430) =
                             (uint)bVar23 * iVar78 | (uint)!bVar23 * *(int *)(local_848.ray + 0x430)
                        ;
                        *(uint *)(local_848.ray + 0x434) =
                             (uint)bVar24 * iVar79 | (uint)!bVar24 * *(int *)(local_848.ray + 0x434)
                        ;
                        *(uint *)(local_848.ray + 0x438) =
                             (uint)bVar25 * iVar80 | (uint)!bVar25 * *(int *)(local_848.ray + 0x438)
                        ;
                        *(uint *)(local_848.ray + 0x43c) =
                             (uint)bVar26 * iVar81 | (uint)!bVar26 * *(int *)(local_848.ray + 0x43c)
                        ;
                        auVar245 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_848.hit + 0x140));
                        auVar245 = vmovdqu32_avx512f(auVar245);
                        *(undefined1 (*) [64])(local_848.ray + 0x440) = auVar245;
                        auVar245 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_848.hit + 0x180));
                        auVar245 = vmovdqu32_avx512f(auVar245);
                        *(undefined1 (*) [64])(local_848.ray + 0x480) = auVar245;
                        auVar245 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_848.hit + 0x1c0));
                        auVar245 = vmovdqa32_avx512f(auVar245);
                        *(undefined1 (*) [64])(local_848.ray + 0x4c0) = auVar245;
                        auVar245 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_848.hit + 0x200));
                        auVar245 = vmovdqa32_avx512f(auVar245);
                        *(undefined1 (*) [64])(local_848.ray + 0x500) = auVar245;
                        auVar245 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
                      }
                      bVar93 = ~(byte)(1 << ((uint)uVar85 & 0x1f)) & (byte)uVar94;
                      uVar159 = auVar245._0_4_;
                      auVar173._4_4_ = uVar159;
                      auVar173._0_4_ = uVar159;
                      auVar173._8_4_ = uVar159;
                      auVar173._12_4_ = uVar159;
                      auVar173._16_4_ = uVar159;
                      auVar173._20_4_ = uVar159;
                      auVar173._24_4_ = uVar159;
                      auVar173._28_4_ = uVar159;
                      uVar180 = vcmpps_avx512vl(auVar229._0_32_,auVar173,2);
                      if ((bVar93 & (byte)uVar180) == 0) goto LAB_01b83d49;
                      bVar93 = bVar93 & (byte)uVar180;
                      uVar94 = (ulong)bVar93;
                      auVar174._8_4_ = 0x7f800000;
                      auVar174._0_8_ = 0x7f8000007f800000;
                      auVar174._12_4_ = 0x7f800000;
                      auVar174._16_4_ = 0x7f800000;
                      auVar174._20_4_ = 0x7f800000;
                      auVar174._24_4_ = 0x7f800000;
                      auVar174._28_4_ = 0x7f800000;
                      auVar122 = vblendmps_avx512vl(auVar174,auVar229._0_32_);
                      auVar147._0_4_ =
                           (uint)(bVar93 & 1) * auVar122._0_4_ |
                           (uint)!(bool)(bVar93 & 1) * 0x7f800000;
                      bVar13 = (bool)(bVar93 >> 1 & 1);
                      auVar147._4_4_ = (uint)bVar13 * auVar122._4_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar93 >> 2 & 1);
                      auVar147._8_4_ = (uint)bVar13 * auVar122._8_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar93 >> 3 & 1);
                      auVar147._12_4_ = (uint)bVar13 * auVar122._12_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar93 >> 4 & 1);
                      auVar147._16_4_ = (uint)bVar13 * auVar122._16_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar93 >> 5 & 1);
                      auVar147._20_4_ = (uint)bVar13 * auVar122._20_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar93 >> 6 & 1);
                      auVar147._24_4_ = (uint)bVar13 * auVar122._24_4_ | (uint)!bVar13 * 0x7f800000;
                      auVar147._28_4_ =
                           (uint)(bVar93 >> 7) * auVar122._28_4_ |
                           (uint)!(bool)(bVar93 >> 7) * 0x7f800000;
                      auVar122 = vshufps_avx(auVar147,auVar147,0xb1);
                      auVar122 = vminps_avx(auVar147,auVar122);
                      auVar123 = vshufpd_avx(auVar122,auVar122,5);
                      auVar122 = vminps_avx(auVar122,auVar123);
                      auVar123 = vpermpd_avx2(auVar122,0x4e);
                      auVar122 = vminps_avx(auVar122,auVar123);
                      uVar180 = vcmpps_avx512vl(auVar147,auVar122,0);
                      bVar84 = (byte)uVar180 & bVar93;
                      if (bVar84 != 0) {
                        bVar93 = bVar84;
                      }
                      uVar86 = 0;
                      for (uVar87 = (uint)bVar93; (uVar87 & 1) == 0;
                          uVar87 = uVar87 >> 1 | 0x80000000) {
                        uVar86 = uVar86 + 1;
                      }
                      uVar85 = (ulong)uVar86;
                    } while( true );
                  }
                  fVar187 = local_580[uVar85];
                  uVar159 = *(undefined4 *)(local_560 + uVar85 * 4);
                  fVar232 = 1.0 - fVar187;
                  fVar231 = fVar232 * fVar232 * -3.0;
                  auVar216 = ZEXT464((uint)fVar231);
                  auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar232 * fVar232)),
                                            ZEXT416((uint)(fVar187 * fVar232)),ZEXT416(0xc0000000));
                  auVar98 = vfmsub132ss_fma(ZEXT416((uint)(fVar187 * fVar232)),
                                            ZEXT416((uint)(fVar187 * fVar187)),ZEXT416(0x40000000));
                  fVar232 = auVar97._0_4_ * 3.0;
                  fVar179 = auVar98._0_4_ * 3.0;
                  fVar186 = fVar187 * fVar187 * 3.0;
                  auVar220._0_4_ = fVar186 * fVar158;
                  auVar220._4_4_ = fVar186 * fVar176;
                  auVar220._8_4_ = fVar186 * fVar177;
                  auVar220._12_4_ = fVar186 * fVar178;
                  auVar224 = ZEXT1664(auVar220);
                  auVar193._4_4_ = fVar179;
                  auVar193._0_4_ = fVar179;
                  auVar193._8_4_ = fVar179;
                  auVar193._12_4_ = fVar179;
                  auVar97 = vfmadd132ps_fma(auVar193,auVar220,auVar102);
                  auVar203._4_4_ = fVar232;
                  auVar203._0_4_ = fVar232;
                  auVar203._8_4_ = fVar232;
                  auVar203._12_4_ = fVar232;
                  auVar97 = vfmadd132ps_fma(auVar203,auVar97,auVar28);
                  auVar194._4_4_ = fVar231;
                  auVar194._0_4_ = fVar231;
                  auVar194._8_4_ = fVar231;
                  auVar194._12_4_ = fVar231;
                  auVar97 = vfmadd132ps_fma(auVar194,auVar97,auVar27);
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_540 + uVar85 * 4);
                  *(int *)(ray + k * 4 + 0x300) = auVar97._0_4_;
                  uVar9 = vextractps_avx(auVar97,1);
                  *(undefined4 *)(ray + k * 4 + 0x340) = uVar9;
                  uVar9 = vextractps_avx(auVar97,2);
                  *(undefined4 *)(ray + k * 4 + 0x380) = uVar9;
                  *(float *)(ray + k * 4 + 0x3c0) = fVar187;
                  *(undefined4 *)(ray + k * 4 + 0x400) = uVar159;
                  *(uint *)(ray + k * 4 + 0x440) = uVar7;
                  *(uint *)(ray + k * 4 + 0x480) = uVar91;
                  *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01b83d49:
      auVar245 = local_400;
      if (8 < iVar8) {
        local_7c0 = vpbroadcastd_avx512vl();
        local_400._4_4_ = local_7e0._0_4_;
        local_400._0_4_ = local_7e0._0_4_;
        local_400._8_4_ = local_7e0._0_4_;
        local_400._12_4_ = local_7e0._0_4_;
        local_400._16_4_ = local_7e0._0_4_;
        local_400._20_4_ = local_7e0._0_4_;
        local_400._24_4_ = local_7e0._0_4_;
        local_400._32_32_ = auVar245._32_32_;
        local_400._28_4_ = local_7e0._0_4_;
        uStack_79c = local_7a0;
        uStack_798 = local_7a0;
        uStack_794 = local_7a0;
        uStack_790 = local_7a0;
        uStack_78c = local_7a0;
        uStack_788 = local_7a0;
        uStack_784 = local_7a0;
        local_3a0 = 1.0 / (float)local_480._0_4_;
        fStack_39c = local_3a0;
        fStack_398 = local_3a0;
        fStack_394 = local_3a0;
        fStack_390 = local_3a0;
        fStack_38c = local_3a0;
        fStack_388 = local_3a0;
        fStack_384 = local_3a0;
        auVar245 = vpbroadcastd_avx512f();
        local_480 = vmovdqa64_avx512f(auVar245);
        auVar245 = vpbroadcastd_avx512f();
        local_440 = vmovdqa64_avx512f(auVar245);
        lVar88 = 8;
LAB_01b83e06:
        auVar122 = vpbroadcastd_avx512vl();
        auVar122 = vpor_avx2(auVar122,_DAT_01fe9900);
        uVar35 = vpcmpd_avx512vl(auVar122,local_7c0,1);
        auVar122 = *(undefined1 (*) [32])(bezier_basis0 + lVar88 * 4 + lVar37);
        auVar123 = *(undefined1 (*) [32])(lVar37 + 0x21aa768 + lVar88 * 4);
        auVar121 = *(undefined1 (*) [32])(lVar37 + 0x21aabec + lVar88 * 4);
        auVar120 = *(undefined1 (*) [32])(lVar37 + 0x21ab070 + lVar88 * 4);
        fVar187 = auVar120._0_4_;
        auVar245._0_4_ = fVar187 * (float)local_720._0_4_;
        fVar231 = auVar120._4_4_;
        auVar245._4_4_ = fVar231 * (float)local_720._4_4_;
        fVar232 = auVar120._8_4_;
        auVar245._8_4_ = fVar232 * fStack_718;
        fVar179 = auVar120._12_4_;
        auVar245._12_4_ = fVar179 * fStack_714;
        fVar186 = auVar120._16_4_;
        auVar245._16_4_ = fVar186 * fStack_710;
        fVar199 = auVar120._20_4_;
        auVar245._20_4_ = fVar199 * fStack_70c;
        auVar245._28_36_ = auVar224._28_36_;
        fVar95 = auVar120._24_4_;
        auVar245._24_4_ = fVar95 * fStack_708;
        auVar224._0_4_ = fVar187 * (float)local_740._0_4_;
        auVar224._4_4_ = fVar231 * (float)local_740._4_4_;
        auVar224._8_4_ = fVar232 * fStack_738;
        auVar224._12_4_ = fVar179 * fStack_734;
        auVar224._16_4_ = fVar186 * fStack_730;
        auVar224._20_4_ = fVar199 * fStack_72c;
        auVar224._28_36_ = auVar216._28_36_;
        auVar224._24_4_ = fVar95 * fStack_728;
        auVar108 = vmulps_avx512vl(local_380,auVar120);
        auVar109 = vfmadd231ps_avx512vl(auVar245._0_32_,auVar121,local_6e0);
        auVar119 = vfmadd231ps_avx512vl(auVar224._0_32_,auVar121,local_700);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar121,local_360);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar123,local_6a0);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar123,local_6c0);
        auVar110 = vfmadd231ps_avx512vl(auVar108,auVar123,local_340);
        auVar97 = vfmadd231ps_fma(auVar109,auVar122,local_660);
        auVar224 = ZEXT1664(auVar97);
        auVar98 = vfmadd231ps_fma(auVar119,auVar122,local_680);
        auVar216 = ZEXT1664(auVar98);
        auVar108 = *(undefined1 (*) [32])(bezier_basis1 + lVar88 * 4 + lVar37);
        auVar109 = *(undefined1 (*) [32])(lVar37 + 0x21acb88 + lVar88 * 4);
        auVar111 = vfmadd231ps_avx512vl(auVar110,auVar122,local_320);
        auVar119 = *(undefined1 (*) [32])(lVar37 + 0x21ad00c + lVar88 * 4);
        auVar110 = *(undefined1 (*) [32])(lVar37 + 0x21ad490 + lVar88 * 4);
        fVar96 = auVar110._0_4_;
        auVar148._0_4_ = fVar96 * (float)local_720._0_4_;
        fVar149 = auVar110._4_4_;
        auVar148._4_4_ = fVar149 * (float)local_720._4_4_;
        fVar150 = auVar110._8_4_;
        auVar148._8_4_ = fVar150 * fStack_718;
        fVar151 = auVar110._12_4_;
        auVar148._12_4_ = fVar151 * fStack_714;
        fVar152 = auVar110._16_4_;
        auVar148._16_4_ = fVar152 * fStack_710;
        fVar154 = auVar110._20_4_;
        auVar148._20_4_ = fVar154 * fStack_70c;
        auVar148._28_36_ = auVar229._28_36_;
        fVar155 = auVar110._24_4_;
        auVar148._24_4_ = fVar155 * fStack_708;
        auVar49._4_4_ = fVar149 * (float)local_740._4_4_;
        auVar49._0_4_ = fVar96 * (float)local_740._0_4_;
        auVar49._8_4_ = fVar150 * fStack_738;
        auVar49._12_4_ = fVar151 * fStack_734;
        auVar49._16_4_ = fVar152 * fStack_730;
        auVar49._20_4_ = fVar154 * fStack_72c;
        auVar49._24_4_ = fVar155 * fStack_728;
        auVar49._28_4_ = uStack_724;
        auVar113 = vmulps_avx512vl(local_380,auVar110);
        auVar112 = vfmadd231ps_avx512vl(auVar148._0_32_,auVar119,local_6e0);
        auVar114 = vfmadd231ps_avx512vl(auVar49,auVar119,local_700);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar119,local_360);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar109,local_6a0);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar109,local_6c0);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar109,local_340);
        auVar104 = vfmadd231ps_fma(auVar112,auVar108,local_660);
        auVar229 = ZEXT1664(auVar104);
        auVar29 = vfmadd231ps_fma(auVar114,auVar108,local_680);
        auVar112 = vfmadd231ps_avx512vl(auVar113,auVar108,local_320);
        auVar114 = vmaxps_avx512vl(auVar111,auVar112);
        auVar113 = vsubps_avx(ZEXT1632(auVar104),ZEXT1632(auVar97));
        auVar115 = vsubps_avx512vl(ZEXT1632(auVar29),ZEXT1632(auVar98));
        auVar116 = vmulps_avx512vl(ZEXT1632(auVar98),auVar113);
        auVar117 = vmulps_avx512vl(ZEXT1632(auVar97),auVar115);
        auVar116 = vsubps_avx512vl(auVar116,auVar117);
        auVar117 = vmulps_avx512vl(auVar115,auVar115);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar113,auVar113);
        auVar114 = vmulps_avx512vl(auVar114,auVar114);
        auVar114 = vmulps_avx512vl(auVar114,auVar117);
        auVar116 = vmulps_avx512vl(auVar116,auVar116);
        uVar180 = vcmpps_avx512vl(auVar116,auVar114,2);
        bVar93 = (byte)uVar35 & (byte)uVar180;
        if (bVar93 != 0) {
          fVar153 = local_500._0_4_;
          fVar156 = local_500._4_4_;
          auVar50._4_4_ = fVar156 * fVar149;
          auVar50._0_4_ = fVar153 * fVar96;
          fVar96 = local_500._8_4_;
          auVar50._8_4_ = fVar96 * fVar150;
          fVar149 = local_500._12_4_;
          auVar50._12_4_ = fVar149 * fVar151;
          fVar150 = local_500._16_4_;
          auVar50._16_4_ = fVar150 * fVar152;
          fVar151 = local_500._20_4_;
          auVar50._20_4_ = fVar151 * fVar154;
          fVar152 = local_500._24_4_;
          auVar50._24_4_ = fVar152 * fVar155;
          auVar50._28_4_ = auVar110._28_4_;
          auVar119 = vfmadd213ps_avx512vl(auVar119,local_4e0,auVar50);
          auVar109 = vfmadd213ps_avx512vl(auVar109,local_4c0,auVar119);
          auVar108 = vfmadd213ps_avx512vl(auVar108,local_4a0,auVar109);
          auVar51._4_4_ = fVar156 * fVar231;
          auVar51._0_4_ = fVar153 * fVar187;
          auVar51._8_4_ = fVar96 * fVar232;
          auVar51._12_4_ = fVar149 * fVar179;
          auVar51._16_4_ = fVar150 * fVar186;
          auVar51._20_4_ = fVar151 * fVar199;
          auVar51._24_4_ = fVar152 * fVar95;
          auVar51._28_4_ = auVar120._28_4_;
          auVar121 = vfmadd213ps_avx512vl(auVar121,local_4e0,auVar51);
          auVar123 = vfmadd213ps_avx512vl(auVar123,local_4c0,auVar121);
          auVar109 = vfmadd213ps_avx512vl(auVar122,local_4a0,auVar123);
          auVar122 = *(undefined1 (*) [32])(lVar37 + 0x21ab4f4 + lVar88 * 4);
          auVar123 = *(undefined1 (*) [32])(lVar37 + 0x21ab978 + lVar88 * 4);
          auVar121 = *(undefined1 (*) [32])(lVar37 + 0x21abdfc + lVar88 * 4);
          auVar120 = *(undefined1 (*) [32])(lVar37 + 0x21ac280 + lVar88 * 4);
          auVar119 = vmulps_avx512vl(_local_720,auVar120);
          auVar110 = vmulps_avx512vl(_local_740,auVar120);
          auVar52._4_4_ = fVar156 * auVar120._4_4_;
          auVar52._0_4_ = fVar153 * auVar120._0_4_;
          auVar52._8_4_ = fVar96 * auVar120._8_4_;
          auVar52._12_4_ = fVar149 * auVar120._12_4_;
          auVar52._16_4_ = fVar150 * auVar120._16_4_;
          auVar52._20_4_ = fVar151 * auVar120._20_4_;
          auVar52._24_4_ = fVar152 * auVar120._24_4_;
          auVar52._28_4_ = auVar120._28_4_;
          auVar120 = vfmadd231ps_avx512vl(auVar119,auVar121,local_6e0);
          auVar119 = vfmadd231ps_avx512vl(auVar110,auVar121,local_700);
          auVar121 = vfmadd231ps_avx512vl(auVar52,local_4e0,auVar121);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar123,local_6a0);
          auVar119 = vfmadd231ps_avx512vl(auVar119,auVar123,local_6c0);
          auVar123 = vfmadd231ps_avx512vl(auVar121,local_4c0,auVar123);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar122,local_660);
          auVar119 = vfmadd231ps_avx512vl(auVar119,auVar122,local_680);
          auVar110 = vfmadd231ps_avx512vl(auVar123,local_4a0,auVar122);
          auVar122 = *(undefined1 (*) [32])(lVar37 + 0x21ad914 + lVar88 * 4);
          auVar123 = *(undefined1 (*) [32])(lVar37 + 0x21ae21c + lVar88 * 4);
          auVar121 = *(undefined1 (*) [32])(lVar37 + 0x21ae6a0 + lVar88 * 4);
          auVar114 = vmulps_avx512vl(_local_720,auVar121);
          auVar116 = vmulps_avx512vl(_local_740,auVar121);
          auVar121 = vmulps_avx512vl(local_500,auVar121);
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar123,local_6e0);
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar123,local_700);
          auVar121 = vfmadd231ps_avx512vl(auVar121,local_4e0,auVar123);
          auVar247 = ZEXT1664(auVar247._0_16_);
          auVar123 = *(undefined1 (*) [32])(lVar37 + 0x21add98 + lVar88 * 4);
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar123,local_6a0);
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar123,local_6c0);
          auVar123 = vfmadd231ps_avx512vl(auVar121,local_4c0,auVar123);
          auVar175 = ZEXT1664(auVar175._0_16_);
          auVar121 = vfmadd231ps_avx512vl(auVar114,auVar122,local_660);
          auVar114 = vfmadd231ps_avx512vl(auVar116,auVar122,local_680);
          auVar123 = vfmadd231ps_avx512vl(auVar123,local_4a0,auVar122);
          auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar120,auVar116);
          vandps_avx512vl(auVar119,auVar116);
          auVar122 = vmaxps_avx(auVar116,auVar116);
          vandps_avx512vl(auVar110,auVar116);
          auVar122 = vmaxps_avx(auVar122,auVar116);
          uVar85 = vcmpps_avx512vl(auVar122,local_400._0_32_,1);
          bVar13 = (bool)((byte)uVar85 & 1);
          auVar135._0_4_ = (float)((uint)bVar13 * auVar113._0_4_ | (uint)!bVar13 * auVar120._0_4_);
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar135._4_4_ = (float)((uint)bVar13 * auVar113._4_4_ | (uint)!bVar13 * auVar120._4_4_);
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar135._8_4_ = (float)((uint)bVar13 * auVar113._8_4_ | (uint)!bVar13 * auVar120._8_4_);
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar135._12_4_ =
               (float)((uint)bVar13 * auVar113._12_4_ | (uint)!bVar13 * auVar120._12_4_);
          bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
          auVar135._16_4_ =
               (float)((uint)bVar13 * auVar113._16_4_ | (uint)!bVar13 * auVar120._16_4_);
          bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
          auVar135._20_4_ =
               (float)((uint)bVar13 * auVar113._20_4_ | (uint)!bVar13 * auVar120._20_4_);
          bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
          auVar135._24_4_ =
               (float)((uint)bVar13 * auVar113._24_4_ | (uint)!bVar13 * auVar120._24_4_);
          bVar13 = SUB81(uVar85 >> 7,0);
          auVar135._28_4_ = (uint)bVar13 * auVar113._28_4_ | (uint)!bVar13 * auVar120._28_4_;
          bVar13 = (bool)((byte)uVar85 & 1);
          auVar136._0_4_ = (float)((uint)bVar13 * auVar115._0_4_ | (uint)!bVar13 * auVar119._0_4_);
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar136._4_4_ = (float)((uint)bVar13 * auVar115._4_4_ | (uint)!bVar13 * auVar119._4_4_);
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar136._8_4_ = (float)((uint)bVar13 * auVar115._8_4_ | (uint)!bVar13 * auVar119._8_4_);
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar136._12_4_ =
               (float)((uint)bVar13 * auVar115._12_4_ | (uint)!bVar13 * auVar119._12_4_);
          bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
          auVar136._16_4_ =
               (float)((uint)bVar13 * auVar115._16_4_ | (uint)!bVar13 * auVar119._16_4_);
          bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
          auVar136._20_4_ =
               (float)((uint)bVar13 * auVar115._20_4_ | (uint)!bVar13 * auVar119._20_4_);
          bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
          auVar136._24_4_ =
               (float)((uint)bVar13 * auVar115._24_4_ | (uint)!bVar13 * auVar119._24_4_);
          bVar13 = SUB81(uVar85 >> 7,0);
          auVar136._28_4_ = (uint)bVar13 * auVar115._28_4_ | (uint)!bVar13 * auVar119._28_4_;
          vandps_avx512vl(auVar121,auVar116);
          vandps_avx512vl(auVar114,auVar116);
          auVar122 = vmaxps_avx(auVar136,auVar136);
          vandps_avx512vl(auVar123,auVar116);
          auVar122 = vmaxps_avx(auVar122,auVar136);
          uVar85 = vcmpps_avx512vl(auVar122,local_400._0_32_,1);
          bVar13 = (bool)((byte)uVar85 & 1);
          auVar137._0_4_ = (uint)bVar13 * auVar113._0_4_ | (uint)!bVar13 * auVar121._0_4_;
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar137._4_4_ = (uint)bVar13 * auVar113._4_4_ | (uint)!bVar13 * auVar121._4_4_;
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar137._8_4_ = (uint)bVar13 * auVar113._8_4_ | (uint)!bVar13 * auVar121._8_4_;
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar137._12_4_ = (uint)bVar13 * auVar113._12_4_ | (uint)!bVar13 * auVar121._12_4_;
          bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
          auVar137._16_4_ = (uint)bVar13 * auVar113._16_4_ | (uint)!bVar13 * auVar121._16_4_;
          bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
          auVar137._20_4_ = (uint)bVar13 * auVar113._20_4_ | (uint)!bVar13 * auVar121._20_4_;
          bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
          auVar137._24_4_ = (uint)bVar13 * auVar113._24_4_ | (uint)!bVar13 * auVar121._24_4_;
          bVar13 = SUB81(uVar85 >> 7,0);
          auVar137._28_4_ = (uint)bVar13 * auVar113._28_4_ | (uint)!bVar13 * auVar121._28_4_;
          bVar13 = (bool)((byte)uVar85 & 1);
          auVar138._0_4_ = (float)((uint)bVar13 * auVar115._0_4_ | (uint)!bVar13 * auVar114._0_4_);
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar138._4_4_ = (float)((uint)bVar13 * auVar115._4_4_ | (uint)!bVar13 * auVar114._4_4_);
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar138._8_4_ = (float)((uint)bVar13 * auVar115._8_4_ | (uint)!bVar13 * auVar114._8_4_);
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar138._12_4_ =
               (float)((uint)bVar13 * auVar115._12_4_ | (uint)!bVar13 * auVar114._12_4_);
          bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
          auVar138._16_4_ =
               (float)((uint)bVar13 * auVar115._16_4_ | (uint)!bVar13 * auVar114._16_4_);
          bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
          auVar138._20_4_ =
               (float)((uint)bVar13 * auVar115._20_4_ | (uint)!bVar13 * auVar114._20_4_);
          bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
          auVar138._24_4_ =
               (float)((uint)bVar13 * auVar115._24_4_ | (uint)!bVar13 * auVar114._24_4_);
          bVar13 = SUB81(uVar85 >> 7,0);
          auVar138._28_4_ = (uint)bVar13 * auVar115._28_4_ | (uint)!bVar13 * auVar114._28_4_;
          auVar235._8_4_ = 0x80000000;
          auVar235._0_8_ = 0x8000000080000000;
          auVar235._12_4_ = 0x80000000;
          auVar235._16_4_ = 0x80000000;
          auVar235._20_4_ = 0x80000000;
          auVar235._24_4_ = 0x80000000;
          auVar235._28_4_ = 0x80000000;
          auVar122 = vxorps_avx512vl(auVar137,auVar235);
          auVar107 = vxorps_avx512vl(auVar116._0_16_,auVar116._0_16_);
          auVar123 = vfmadd213ps_avx512vl(auVar135,auVar135,ZEXT1632(auVar107));
          auVar30 = vfmadd231ps_fma(auVar123,auVar136,auVar136);
          auVar123 = vrsqrt14ps_avx512vl(ZEXT1632(auVar30));
          auVar243._8_4_ = 0xbf000000;
          auVar243._0_8_ = 0xbf000000bf000000;
          auVar243._12_4_ = 0xbf000000;
          auVar243._16_4_ = 0xbf000000;
          auVar243._20_4_ = 0xbf000000;
          auVar243._24_4_ = 0xbf000000;
          auVar243._28_4_ = 0xbf000000;
          fVar187 = auVar123._0_4_;
          fVar231 = auVar123._4_4_;
          fVar232 = auVar123._8_4_;
          fVar179 = auVar123._12_4_;
          fVar186 = auVar123._16_4_;
          fVar199 = auVar123._20_4_;
          fVar95 = auVar123._24_4_;
          auVar53._4_4_ = fVar231 * fVar231 * fVar231 * auVar30._4_4_ * -0.5;
          auVar53._0_4_ = fVar187 * fVar187 * fVar187 * auVar30._0_4_ * -0.5;
          auVar53._8_4_ = fVar232 * fVar232 * fVar232 * auVar30._8_4_ * -0.5;
          auVar53._12_4_ = fVar179 * fVar179 * fVar179 * auVar30._12_4_ * -0.5;
          auVar53._16_4_ = fVar186 * fVar186 * fVar186 * -0.0;
          auVar53._20_4_ = fVar199 * fVar199 * fVar199 * -0.0;
          auVar53._24_4_ = fVar95 * fVar95 * fVar95 * -0.0;
          auVar53._28_4_ = auVar136._28_4_;
          auVar121 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar123 = vfmadd231ps_avx512vl(auVar53,auVar121,auVar123);
          auVar54._4_4_ = auVar136._4_4_ * auVar123._4_4_;
          auVar54._0_4_ = auVar136._0_4_ * auVar123._0_4_;
          auVar54._8_4_ = auVar136._8_4_ * auVar123._8_4_;
          auVar54._12_4_ = auVar136._12_4_ * auVar123._12_4_;
          auVar54._16_4_ = auVar136._16_4_ * auVar123._16_4_;
          auVar54._20_4_ = auVar136._20_4_ * auVar123._20_4_;
          auVar54._24_4_ = auVar136._24_4_ * auVar123._24_4_;
          auVar54._28_4_ = 0;
          auVar55._4_4_ = auVar123._4_4_ * -auVar135._4_4_;
          auVar55._0_4_ = auVar123._0_4_ * -auVar135._0_4_;
          auVar55._8_4_ = auVar123._8_4_ * -auVar135._8_4_;
          auVar55._12_4_ = auVar123._12_4_ * -auVar135._12_4_;
          auVar55._16_4_ = auVar123._16_4_ * -auVar135._16_4_;
          auVar55._20_4_ = auVar123._20_4_ * -auVar135._20_4_;
          auVar55._24_4_ = auVar123._24_4_ * -auVar135._24_4_;
          auVar55._28_4_ = auVar136._28_4_;
          auVar120 = vmulps_avx512vl(auVar123,ZEXT1632(auVar107));
          auVar110 = ZEXT1632(auVar107);
          auVar123 = vfmadd213ps_avx512vl(auVar137,auVar137,auVar110);
          auVar123 = vfmadd231ps_avx512vl(auVar123,auVar138,auVar138);
          auVar119 = vrsqrt14ps_avx512vl(auVar123);
          auVar123 = vmulps_avx512vl(auVar123,auVar243);
          fVar187 = auVar119._0_4_;
          fVar231 = auVar119._4_4_;
          fVar232 = auVar119._8_4_;
          fVar179 = auVar119._12_4_;
          fVar186 = auVar119._16_4_;
          fVar199 = auVar119._20_4_;
          fVar95 = auVar119._24_4_;
          auVar56._4_4_ = fVar231 * fVar231 * fVar231 * auVar123._4_4_;
          auVar56._0_4_ = fVar187 * fVar187 * fVar187 * auVar123._0_4_;
          auVar56._8_4_ = fVar232 * fVar232 * fVar232 * auVar123._8_4_;
          auVar56._12_4_ = fVar179 * fVar179 * fVar179 * auVar123._12_4_;
          auVar56._16_4_ = fVar186 * fVar186 * fVar186 * auVar123._16_4_;
          auVar56._20_4_ = fVar199 * fVar199 * fVar199 * auVar123._20_4_;
          auVar56._24_4_ = fVar95 * fVar95 * fVar95 * auVar123._24_4_;
          auVar56._28_4_ = auVar123._28_4_;
          auVar123 = vfmadd231ps_avx512vl(auVar56,auVar121,auVar119);
          auVar57._4_4_ = auVar138._4_4_ * auVar123._4_4_;
          auVar57._0_4_ = auVar138._0_4_ * auVar123._0_4_;
          auVar57._8_4_ = auVar138._8_4_ * auVar123._8_4_;
          auVar57._12_4_ = auVar138._12_4_ * auVar123._12_4_;
          auVar57._16_4_ = auVar138._16_4_ * auVar123._16_4_;
          auVar57._20_4_ = auVar138._20_4_ * auVar123._20_4_;
          auVar57._24_4_ = auVar138._24_4_ * auVar123._24_4_;
          auVar57._28_4_ = auVar119._28_4_;
          auVar58._4_4_ = auVar123._4_4_ * auVar122._4_4_;
          auVar58._0_4_ = auVar123._0_4_ * auVar122._0_4_;
          auVar58._8_4_ = auVar123._8_4_ * auVar122._8_4_;
          auVar58._12_4_ = auVar123._12_4_ * auVar122._12_4_;
          auVar58._16_4_ = auVar123._16_4_ * auVar122._16_4_;
          auVar58._20_4_ = auVar123._20_4_ * auVar122._20_4_;
          auVar58._24_4_ = auVar123._24_4_ * auVar122._24_4_;
          auVar58._28_4_ = auVar122._28_4_;
          auVar122 = vmulps_avx512vl(auVar123,auVar110);
          auVar30 = vfmadd213ps_fma(auVar54,auVar111,ZEXT1632(auVar97));
          auVar31 = vfmadd213ps_fma(auVar55,auVar111,ZEXT1632(auVar98));
          auVar121 = vfmadd213ps_avx512vl(auVar120,auVar111,auVar109);
          auVar119 = vfmadd213ps_avx512vl(auVar57,auVar112,ZEXT1632(auVar104));
          auVar33 = vfnmadd213ps_fma(auVar54,auVar111,ZEXT1632(auVar97));
          auVar97 = vfmadd213ps_fma(auVar58,auVar112,ZEXT1632(auVar29));
          auVar34 = vfnmadd213ps_fma(auVar55,auVar111,ZEXT1632(auVar98));
          auVar98 = vfmadd213ps_fma(auVar122,auVar112,auVar108);
          auVar246 = vfnmadd231ps_fma(auVar109,auVar111,auVar120);
          auVar103 = vfnmadd213ps_fma(auVar57,auVar112,ZEXT1632(auVar104));
          auVar105 = vfnmadd213ps_fma(auVar58,auVar112,ZEXT1632(auVar29));
          auVar106 = vfnmadd231ps_fma(auVar108,auVar112,auVar122);
          auVar108 = vsubps_avx512vl(auVar119,ZEXT1632(auVar33));
          auVar122 = vsubps_avx(ZEXT1632(auVar97),ZEXT1632(auVar34));
          auVar123 = vsubps_avx(ZEXT1632(auVar98),ZEXT1632(auVar246));
          auVar59._4_4_ = auVar122._4_4_ * auVar246._4_4_;
          auVar59._0_4_ = auVar122._0_4_ * auVar246._0_4_;
          auVar59._8_4_ = auVar122._8_4_ * auVar246._8_4_;
          auVar59._12_4_ = auVar122._12_4_ * auVar246._12_4_;
          auVar59._16_4_ = auVar122._16_4_ * 0.0;
          auVar59._20_4_ = auVar122._20_4_ * 0.0;
          auVar59._24_4_ = auVar122._24_4_ * 0.0;
          auVar59._28_4_ = auVar120._28_4_;
          auVar104 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar34),auVar123);
          auVar60._4_4_ = auVar123._4_4_ * auVar33._4_4_;
          auVar60._0_4_ = auVar123._0_4_ * auVar33._0_4_;
          auVar60._8_4_ = auVar123._8_4_ * auVar33._8_4_;
          auVar60._12_4_ = auVar123._12_4_ * auVar33._12_4_;
          auVar60._16_4_ = auVar123._16_4_ * 0.0;
          auVar60._20_4_ = auVar123._20_4_ * 0.0;
          auVar60._24_4_ = auVar123._24_4_ * 0.0;
          auVar60._28_4_ = auVar123._28_4_;
          auVar29 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar246),auVar108);
          auVar61._4_4_ = auVar34._4_4_ * auVar108._4_4_;
          auVar61._0_4_ = auVar34._0_4_ * auVar108._0_4_;
          auVar61._8_4_ = auVar34._8_4_ * auVar108._8_4_;
          auVar61._12_4_ = auVar34._12_4_ * auVar108._12_4_;
          auVar61._16_4_ = auVar108._16_4_ * 0.0;
          auVar61._20_4_ = auVar108._20_4_ * 0.0;
          auVar61._24_4_ = auVar108._24_4_ * 0.0;
          auVar61._28_4_ = auVar108._28_4_;
          auVar32 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar33),auVar122);
          auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar32),auVar110,ZEXT1632(auVar29));
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar110,ZEXT1632(auVar104));
          auVar116 = ZEXT1632(auVar107);
          uVar85 = vcmpps_avx512vl(auVar122,auVar116,2);
          bVar84 = (byte)uVar85;
          fVar150 = (float)((uint)(bVar84 & 1) * auVar30._0_4_ |
                           (uint)!(bool)(bVar84 & 1) * auVar103._0_4_);
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          fVar152 = (float)((uint)bVar13 * auVar30._4_4_ | (uint)!bVar13 * auVar103._4_4_);
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          fVar155 = (float)((uint)bVar13 * auVar30._8_4_ | (uint)!bVar13 * auVar103._8_4_);
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          fVar156 = (float)((uint)bVar13 * auVar30._12_4_ | (uint)!bVar13 * auVar103._12_4_);
          auVar110 = ZEXT1632(CONCAT412(fVar156,CONCAT48(fVar155,CONCAT44(fVar152,fVar150))));
          fVar151 = (float)((uint)(bVar84 & 1) * auVar31._0_4_ |
                           (uint)!(bool)(bVar84 & 1) * auVar105._0_4_);
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          fVar154 = (float)((uint)bVar13 * auVar31._4_4_ | (uint)!bVar13 * auVar105._4_4_);
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          fVar153 = (float)((uint)bVar13 * auVar31._8_4_ | (uint)!bVar13 * auVar105._8_4_);
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          fVar157 = (float)((uint)bVar13 * auVar31._12_4_ | (uint)!bVar13 * auVar105._12_4_);
          auVar113 = ZEXT1632(CONCAT412(fVar157,CONCAT48(fVar153,CONCAT44(fVar154,fVar151))));
          auVar139._0_4_ =
               (float)((uint)(bVar84 & 1) * auVar121._0_4_ |
                      (uint)!(bool)(bVar84 & 1) * auVar106._0_4_);
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar139._4_4_ = (float)((uint)bVar13 * auVar121._4_4_ | (uint)!bVar13 * auVar106._4_4_);
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar139._8_4_ = (float)((uint)bVar13 * auVar121._8_4_ | (uint)!bVar13 * auVar106._8_4_);
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar139._12_4_ =
               (float)((uint)bVar13 * auVar121._12_4_ | (uint)!bVar13 * auVar106._12_4_);
          fVar187 = (float)((uint)((byte)(uVar85 >> 4) & 1) * auVar121._16_4_);
          auVar139._16_4_ = fVar187;
          fVar231 = (float)((uint)((byte)(uVar85 >> 5) & 1) * auVar121._20_4_);
          auVar139._20_4_ = fVar231;
          fVar232 = (float)((uint)((byte)(uVar85 >> 6) & 1) * auVar121._24_4_);
          auVar139._24_4_ = fVar232;
          iVar1 = (uint)(byte)(uVar85 >> 7) * auVar121._28_4_;
          auVar139._28_4_ = iVar1;
          auVar122 = vblendmps_avx512vl(ZEXT1632(auVar33),auVar119);
          auVar140._0_4_ =
               (uint)(bVar84 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar104._0_4_;
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar140._4_4_ = (uint)bVar13 * auVar122._4_4_ | (uint)!bVar13 * auVar104._4_4_;
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar140._8_4_ = (uint)bVar13 * auVar122._8_4_ | (uint)!bVar13 * auVar104._8_4_;
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar140._12_4_ = (uint)bVar13 * auVar122._12_4_ | (uint)!bVar13 * auVar104._12_4_;
          auVar140._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * auVar122._16_4_;
          auVar140._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * auVar122._20_4_;
          auVar140._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * auVar122._24_4_;
          auVar140._28_4_ = (uint)(byte)(uVar85 >> 7) * auVar122._28_4_;
          auVar122 = vblendmps_avx512vl(ZEXT1632(auVar34),ZEXT1632(auVar97));
          auVar141._0_4_ =
               (float)((uint)(bVar84 & 1) * auVar122._0_4_ |
                      (uint)!(bool)(bVar84 & 1) * auVar30._0_4_);
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar141._4_4_ = (float)((uint)bVar13 * auVar122._4_4_ | (uint)!bVar13 * auVar30._4_4_);
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar141._8_4_ = (float)((uint)bVar13 * auVar122._8_4_ | (uint)!bVar13 * auVar30._8_4_);
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar141._12_4_ = (float)((uint)bVar13 * auVar122._12_4_ | (uint)!bVar13 * auVar30._12_4_)
          ;
          fVar199 = (float)((uint)((byte)(uVar85 >> 4) & 1) * auVar122._16_4_);
          auVar141._16_4_ = fVar199;
          fVar186 = (float)((uint)((byte)(uVar85 >> 5) & 1) * auVar122._20_4_);
          auVar141._20_4_ = fVar186;
          fVar179 = (float)((uint)((byte)(uVar85 >> 6) & 1) * auVar122._24_4_);
          auVar141._24_4_ = fVar179;
          auVar141._28_4_ = (uint)(byte)(uVar85 >> 7) * auVar122._28_4_;
          auVar122 = vblendmps_avx512vl(ZEXT1632(auVar246),ZEXT1632(auVar98));
          auVar142._0_4_ =
               (float)((uint)(bVar84 & 1) * auVar122._0_4_ |
                      (uint)!(bool)(bVar84 & 1) * auVar31._0_4_);
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar142._4_4_ = (float)((uint)bVar13 * auVar122._4_4_ | (uint)!bVar13 * auVar31._4_4_);
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar142._8_4_ = (float)((uint)bVar13 * auVar122._8_4_ | (uint)!bVar13 * auVar31._8_4_);
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar142._12_4_ = (float)((uint)bVar13 * auVar122._12_4_ | (uint)!bVar13 * auVar31._12_4_)
          ;
          fVar96 = (float)((uint)((byte)(uVar85 >> 4) & 1) * auVar122._16_4_);
          auVar142._16_4_ = fVar96;
          fVar149 = (float)((uint)((byte)(uVar85 >> 5) & 1) * auVar122._20_4_);
          auVar142._20_4_ = fVar149;
          fVar95 = (float)((uint)((byte)(uVar85 >> 6) & 1) * auVar122._24_4_);
          auVar142._24_4_ = fVar95;
          iVar2 = (uint)(byte)(uVar85 >> 7) * auVar122._28_4_;
          auVar142._28_4_ = iVar2;
          auVar143._0_4_ =
               (uint)(bVar84 & 1) * (int)auVar33._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar119._0_4_;
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar143._4_4_ = (uint)bVar13 * (int)auVar33._4_4_ | (uint)!bVar13 * auVar119._4_4_;
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar143._8_4_ = (uint)bVar13 * (int)auVar33._8_4_ | (uint)!bVar13 * auVar119._8_4_;
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar143._12_4_ = (uint)bVar13 * (int)auVar33._12_4_ | (uint)!bVar13 * auVar119._12_4_;
          auVar143._16_4_ = (uint)!(bool)((byte)(uVar85 >> 4) & 1) * auVar119._16_4_;
          auVar143._20_4_ = (uint)!(bool)((byte)(uVar85 >> 5) & 1) * auVar119._20_4_;
          auVar143._24_4_ = (uint)!(bool)((byte)(uVar85 >> 6) & 1) * auVar119._24_4_;
          auVar143._28_4_ = (uint)!SUB81(uVar85 >> 7,0) * auVar119._28_4_;
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar85 >> 3) & 1);
          bVar14 = (bool)((byte)(uVar85 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar85 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar119 = vsubps_avx512vl(auVar143,auVar110);
          auVar123 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar34._12_4_ |
                                                   (uint)!bVar17 * auVar97._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar34._8_4_ |
                                                            (uint)!bVar15 * auVar97._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar34._4_4_ |
                                                                     (uint)!bVar13 * auVar97._4_4_,
                                                                     (uint)(bVar84 & 1) *
                                                                     (int)auVar34._0_4_ |
                                                                     (uint)!(bool)(bVar84 & 1) *
                                                                     auVar97._0_4_)))),auVar113);
          auVar224 = ZEXT3264(auVar123);
          auVar121 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar246._12_4_ |
                                                   (uint)!bVar18 * auVar98._12_4_,
                                                   CONCAT48((uint)bVar16 * (int)auVar246._8_4_ |
                                                            (uint)!bVar16 * auVar98._8_4_,
                                                            CONCAT44((uint)bVar14 *
                                                                     (int)auVar246._4_4_ |
                                                                     (uint)!bVar14 * auVar98._4_4_,
                                                                     (uint)(bVar84 & 1) *
                                                                     (int)auVar246._0_4_ |
                                                                     (uint)!(bool)(bVar84 & 1) *
                                                                     auVar98._0_4_)))),auVar139);
          auVar120 = vsubps_avx(auVar110,auVar140);
          auVar229 = ZEXT3264(auVar120);
          auVar108 = vsubps_avx(auVar113,auVar141);
          auVar109 = vsubps_avx(auVar139,auVar142);
          auVar62._4_4_ = auVar121._4_4_ * fVar152;
          auVar62._0_4_ = auVar121._0_4_ * fVar150;
          auVar62._8_4_ = auVar121._8_4_ * fVar155;
          auVar62._12_4_ = auVar121._12_4_ * fVar156;
          auVar62._16_4_ = auVar121._16_4_ * 0.0;
          auVar62._20_4_ = auVar121._20_4_ * 0.0;
          auVar62._24_4_ = auVar121._24_4_ * 0.0;
          auVar62._28_4_ = 0;
          auVar97 = vfmsub231ps_fma(auVar62,auVar139,auVar119);
          auVar208._0_4_ = fVar151 * auVar119._0_4_;
          auVar208._4_4_ = fVar154 * auVar119._4_4_;
          auVar208._8_4_ = fVar153 * auVar119._8_4_;
          auVar208._12_4_ = fVar157 * auVar119._12_4_;
          auVar208._16_4_ = auVar119._16_4_ * 0.0;
          auVar208._20_4_ = auVar119._20_4_ * 0.0;
          auVar208._24_4_ = auVar119._24_4_ * 0.0;
          auVar208._28_4_ = 0;
          auVar98 = vfmsub231ps_fma(auVar208,auVar110,auVar123);
          auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar98),auVar116,ZEXT1632(auVar97));
          auVar214._0_4_ = auVar123._0_4_ * auVar139._0_4_;
          auVar214._4_4_ = auVar123._4_4_ * auVar139._4_4_;
          auVar214._8_4_ = auVar123._8_4_ * auVar139._8_4_;
          auVar214._12_4_ = auVar123._12_4_ * auVar139._12_4_;
          auVar214._16_4_ = auVar123._16_4_ * fVar187;
          auVar214._20_4_ = auVar123._20_4_ * fVar231;
          auVar214._24_4_ = auVar123._24_4_ * fVar232;
          auVar214._28_4_ = 0;
          auVar97 = vfmsub231ps_fma(auVar214,auVar113,auVar121);
          auVar114 = vfmadd231ps_avx512vl(auVar122,auVar116,ZEXT1632(auVar97));
          auVar122 = vmulps_avx512vl(auVar109,auVar140);
          auVar122 = vfmsub231ps_avx512vl(auVar122,auVar120,auVar142);
          auVar63._4_4_ = auVar108._4_4_ * auVar142._4_4_;
          auVar63._0_4_ = auVar108._0_4_ * auVar142._0_4_;
          auVar63._8_4_ = auVar108._8_4_ * auVar142._8_4_;
          auVar63._12_4_ = auVar108._12_4_ * auVar142._12_4_;
          auVar63._16_4_ = auVar108._16_4_ * fVar96;
          auVar63._20_4_ = auVar108._20_4_ * fVar149;
          auVar63._24_4_ = auVar108._24_4_ * fVar95;
          auVar63._28_4_ = iVar2;
          auVar97 = vfmsub231ps_fma(auVar63,auVar141,auVar109);
          auVar215._0_4_ = auVar141._0_4_ * auVar120._0_4_;
          auVar215._4_4_ = auVar141._4_4_ * auVar120._4_4_;
          auVar215._8_4_ = auVar141._8_4_ * auVar120._8_4_;
          auVar215._12_4_ = auVar141._12_4_ * auVar120._12_4_;
          auVar215._16_4_ = fVar199 * auVar120._16_4_;
          auVar215._20_4_ = fVar186 * auVar120._20_4_;
          auVar215._24_4_ = fVar179 * auVar120._24_4_;
          auVar215._28_4_ = 0;
          auVar98 = vfmsub231ps_fma(auVar215,auVar108,auVar140);
          auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar98),auVar116,auVar122);
          auVar115 = vfmadd231ps_avx512vl(auVar122,auVar116,ZEXT1632(auVar97));
          auVar216 = ZEXT3264(auVar115);
          auVar122 = vmaxps_avx(auVar114,auVar115);
          uVar180 = vcmpps_avx512vl(auVar122,auVar116,2);
          bVar93 = bVar93 & (byte)uVar180;
          if (bVar93 != 0) {
            uVar159 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar244._4_4_ = uVar159;
            auVar244._0_4_ = uVar159;
            auVar244._8_4_ = uVar159;
            auVar244._12_4_ = uVar159;
            auVar244._16_4_ = uVar159;
            auVar244._20_4_ = uVar159;
            auVar244._24_4_ = uVar159;
            auVar244._28_4_ = uVar159;
            auVar245 = ZEXT3264(auVar244);
            auVar64._4_4_ = auVar109._4_4_ * auVar123._4_4_;
            auVar64._0_4_ = auVar109._0_4_ * auVar123._0_4_;
            auVar64._8_4_ = auVar109._8_4_ * auVar123._8_4_;
            auVar64._12_4_ = auVar109._12_4_ * auVar123._12_4_;
            auVar64._16_4_ = auVar109._16_4_ * auVar123._16_4_;
            auVar64._20_4_ = auVar109._20_4_ * auVar123._20_4_;
            auVar64._24_4_ = auVar109._24_4_ * auVar123._24_4_;
            auVar64._28_4_ = auVar122._28_4_;
            auVar29 = vfmsub231ps_fma(auVar64,auVar108,auVar121);
            auVar65._4_4_ = auVar121._4_4_ * auVar120._4_4_;
            auVar65._0_4_ = auVar121._0_4_ * auVar120._0_4_;
            auVar65._8_4_ = auVar121._8_4_ * auVar120._8_4_;
            auVar65._12_4_ = auVar121._12_4_ * auVar120._12_4_;
            auVar65._16_4_ = auVar121._16_4_ * auVar120._16_4_;
            auVar65._20_4_ = auVar121._20_4_ * auVar120._20_4_;
            auVar65._24_4_ = auVar121._24_4_ * auVar120._24_4_;
            auVar65._28_4_ = auVar121._28_4_;
            auVar104 = vfmsub231ps_fma(auVar65,auVar119,auVar109);
            auVar66._4_4_ = auVar108._4_4_ * auVar119._4_4_;
            auVar66._0_4_ = auVar108._0_4_ * auVar119._0_4_;
            auVar66._8_4_ = auVar108._8_4_ * auVar119._8_4_;
            auVar66._12_4_ = auVar108._12_4_ * auVar119._12_4_;
            auVar66._16_4_ = auVar108._16_4_ * auVar119._16_4_;
            auVar66._20_4_ = auVar108._20_4_ * auVar119._20_4_;
            auVar66._24_4_ = auVar108._24_4_ * auVar119._24_4_;
            auVar66._28_4_ = auVar108._28_4_;
            auVar30 = vfmsub231ps_fma(auVar66,auVar120,auVar123);
            auVar97 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar104),ZEXT1632(auVar30));
            auVar98 = vfmadd231ps_fma(ZEXT1632(auVar97),ZEXT1632(auVar29),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar122 = vrcp14ps_avx512vl(ZEXT1632(auVar98));
            auVar41._8_4_ = 0x3f800000;
            auVar41._0_8_ = 0x3f8000003f800000;
            auVar41._12_4_ = 0x3f800000;
            auVar41._16_4_ = 0x3f800000;
            auVar41._20_4_ = 0x3f800000;
            auVar41._24_4_ = 0x3f800000;
            auVar41._28_4_ = 0x3f800000;
            auVar123 = vfnmadd213ps_avx512vl(auVar122,ZEXT1632(auVar98),auVar41);
            auVar97 = vfmadd132ps_fma(auVar123,auVar122,auVar122);
            auVar224 = ZEXT1664(auVar97);
            auVar67._4_4_ = auVar30._4_4_ * auVar139._4_4_;
            auVar67._0_4_ = auVar30._0_4_ * auVar139._0_4_;
            auVar67._8_4_ = auVar30._8_4_ * auVar139._8_4_;
            auVar67._12_4_ = auVar30._12_4_ * auVar139._12_4_;
            auVar67._16_4_ = fVar187 * 0.0;
            auVar67._20_4_ = fVar231 * 0.0;
            auVar67._24_4_ = fVar232 * 0.0;
            auVar67._28_4_ = iVar1;
            auVar104 = vfmadd231ps_fma(auVar67,auVar113,ZEXT1632(auVar104));
            auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar110,ZEXT1632(auVar29));
            fVar187 = auVar97._0_4_;
            fVar231 = auVar97._4_4_;
            fVar232 = auVar97._8_4_;
            fVar179 = auVar97._12_4_;
            local_800._28_4_ = auVar122._28_4_;
            local_800._0_28_ =
                 ZEXT1628(CONCAT412(auVar104._12_4_ * fVar179,
                                    CONCAT48(auVar104._8_4_ * fVar232,
                                             CONCAT44(auVar104._4_4_ * fVar231,
                                                      auVar104._0_4_ * fVar187))));
            auVar229 = ZEXT3264(local_800);
            uVar180 = vcmpps_avx512vl(local_800,auVar244,2);
            auVar82._4_4_ = uStack_79c;
            auVar82._0_4_ = local_7a0;
            auVar82._8_4_ = uStack_798;
            auVar82._12_4_ = uStack_794;
            auVar82._16_4_ = uStack_790;
            auVar82._20_4_ = uStack_78c;
            auVar82._24_4_ = uStack_788;
            auVar82._28_4_ = uStack_784;
            uVar35 = vcmpps_avx512vl(local_800,auVar82,0xd);
            bVar93 = (byte)uVar180 & (byte)uVar35 & bVar93;
            if (bVar93 != 0) {
              uVar94 = vcmpps_avx512vl(ZEXT1632(auVar98),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar94 = bVar93 & uVar94;
              if ((char)uVar94 != '\0') {
                fVar186 = auVar114._0_4_ * fVar187;
                fVar199 = auVar114._4_4_ * fVar231;
                auVar68._4_4_ = fVar199;
                auVar68._0_4_ = fVar186;
                fVar95 = auVar114._8_4_ * fVar232;
                auVar68._8_4_ = fVar95;
                fVar96 = auVar114._12_4_ * fVar179;
                auVar68._12_4_ = fVar96;
                fVar149 = auVar114._16_4_ * 0.0;
                auVar68._16_4_ = fVar149;
                fVar150 = auVar114._20_4_ * 0.0;
                auVar68._20_4_ = fVar150;
                fVar151 = auVar114._24_4_ * 0.0;
                auVar68._24_4_ = fVar151;
                auVar68._28_4_ = auVar114._28_4_;
                auVar198._8_4_ = 0x3f800000;
                auVar198._0_8_ = 0x3f8000003f800000;
                auVar198._12_4_ = 0x3f800000;
                auVar198._16_4_ = 0x3f800000;
                auVar198._20_4_ = 0x3f800000;
                auVar198._24_4_ = 0x3f800000;
                auVar198._28_4_ = 0x3f800000;
                auVar122 = vsubps_avx(auVar198,auVar68);
                local_640._0_4_ =
                     (float)((uint)(bVar84 & 1) * (int)fVar186 |
                            (uint)!(bool)(bVar84 & 1) * auVar122._0_4_);
                bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                local_640._4_4_ =
                     (float)((uint)bVar13 * (int)fVar199 | (uint)!bVar13 * auVar122._4_4_);
                bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
                local_640._8_4_ =
                     (float)((uint)bVar13 * (int)fVar95 | (uint)!bVar13 * auVar122._8_4_);
                bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
                local_640._12_4_ =
                     (float)((uint)bVar13 * (int)fVar96 | (uint)!bVar13 * auVar122._12_4_);
                bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
                local_640._16_4_ =
                     (float)((uint)bVar13 * (int)fVar149 | (uint)!bVar13 * auVar122._16_4_);
                bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
                local_640._20_4_ =
                     (float)((uint)bVar13 * (int)fVar150 | (uint)!bVar13 * auVar122._20_4_);
                bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
                local_640._24_4_ =
                     (float)((uint)bVar13 * (int)fVar151 | (uint)!bVar13 * auVar122._24_4_);
                bVar13 = SUB81(uVar85 >> 7,0);
                local_640._28_4_ =
                     (float)((uint)bVar13 * auVar114._28_4_ | (uint)!bVar13 * auVar122._28_4_);
                auVar122 = vsubps_avx(auVar112,auVar111);
                auVar97 = vfmadd213ps_fma(auVar122,local_640,auVar111);
                uVar159 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
                auVar42._4_4_ = uVar159;
                auVar42._0_4_ = uVar159;
                auVar42._8_4_ = uVar159;
                auVar42._12_4_ = uVar159;
                auVar42._16_4_ = uVar159;
                auVar42._20_4_ = uVar159;
                auVar42._24_4_ = uVar159;
                auVar42._28_4_ = uVar159;
                auVar122 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar97._12_4_ + auVar97._12_4_,
                                                              CONCAT48(auVar97._8_4_ + auVar97._8_4_
                                                                       ,CONCAT44(auVar97._4_4_ +
                                                                                 auVar97._4_4_,
                                                                                 auVar97._0_4_ +
                                                                                 auVar97._0_4_)))),
                                           auVar42);
                uVar36 = vcmpps_avx512vl(local_800,auVar122,6);
                uVar94 = uVar94 & uVar36;
                bVar93 = (byte)uVar94;
                if (bVar93 != 0) {
                  auVar185._0_4_ = auVar115._0_4_ * fVar187;
                  auVar185._4_4_ = auVar115._4_4_ * fVar231;
                  auVar185._8_4_ = auVar115._8_4_ * fVar232;
                  auVar185._12_4_ = auVar115._12_4_ * fVar179;
                  auVar185._16_4_ = auVar115._16_4_ * 0.0;
                  auVar185._20_4_ = auVar115._20_4_ * 0.0;
                  auVar185._24_4_ = auVar115._24_4_ * 0.0;
                  auVar185._28_4_ = 0;
                  auVar209._8_4_ = 0x3f800000;
                  auVar209._0_8_ = 0x3f8000003f800000;
                  auVar209._12_4_ = 0x3f800000;
                  auVar209._16_4_ = 0x3f800000;
                  auVar209._20_4_ = 0x3f800000;
                  auVar209._24_4_ = 0x3f800000;
                  auVar209._28_4_ = 0x3f800000;
                  auVar122 = vsubps_avx(auVar209,auVar185);
                  auVar144._0_4_ =
                       (uint)(bVar84 & 1) * (int)auVar185._0_4_ |
                       (uint)!(bool)(bVar84 & 1) * auVar122._0_4_;
                  bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                  auVar144._4_4_ =
                       (uint)bVar13 * (int)auVar185._4_4_ | (uint)!bVar13 * auVar122._4_4_;
                  bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
                  auVar144._8_4_ =
                       (uint)bVar13 * (int)auVar185._8_4_ | (uint)!bVar13 * auVar122._8_4_;
                  bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
                  auVar144._12_4_ =
                       (uint)bVar13 * (int)auVar185._12_4_ | (uint)!bVar13 * auVar122._12_4_;
                  bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
                  auVar144._16_4_ =
                       (uint)bVar13 * (int)auVar185._16_4_ | (uint)!bVar13 * auVar122._16_4_;
                  bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
                  auVar144._20_4_ =
                       (uint)bVar13 * (int)auVar185._20_4_ | (uint)!bVar13 * auVar122._20_4_;
                  bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
                  auVar144._24_4_ =
                       (uint)bVar13 * (int)auVar185._24_4_ | (uint)!bVar13 * auVar122._24_4_;
                  auVar144._28_4_ = (uint)!SUB81(uVar85 >> 7,0) * auVar122._28_4_;
                  auVar43._8_4_ = 0x40000000;
                  auVar43._0_8_ = 0x4000000040000000;
                  auVar43._12_4_ = 0x40000000;
                  auVar43._16_4_ = 0x40000000;
                  auVar43._20_4_ = 0x40000000;
                  auVar43._24_4_ = 0x40000000;
                  auVar43._28_4_ = 0x40000000;
                  local_620 = vfmsub132ps_avx512vl(auVar144,auVar209,auVar43);
                  local_5e0 = (undefined4)lVar88;
                  local_5d0 = local_860;
                  uStack_5c8 = uStack_858;
                  local_5c0 = local_870;
                  uStack_5b8 = uStack_868;
                  local_5b0 = local_880;
                  uStack_5a8 = uStack_878;
                  local_5a0 = local_890;
                  uStack_598 = uStack_888;
                  pGVar90 = (context->scene->geometries).items[uVar91].ptr;
                  if ((pGVar90->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    auVar97 = vcvtsi2ss_avx512f(auVar107,local_5e0);
                    fVar187 = auVar97._0_4_;
                    local_580[0] = (fVar187 + local_640._0_4_ + 0.0) * local_3a0;
                    local_580[1] = (fVar187 + local_640._4_4_ + 1.0) * fStack_39c;
                    local_580[2] = (fVar187 + local_640._8_4_ + 2.0) * fStack_398;
                    local_580[3] = (fVar187 + local_640._12_4_ + 3.0) * fStack_394;
                    fStack_570 = (fVar187 + local_640._16_4_ + 4.0) * fStack_390;
                    fStack_56c = (fVar187 + local_640._20_4_ + 5.0) * fStack_38c;
                    fStack_568 = (fVar187 + local_640._24_4_ + 6.0) * fStack_388;
                    fStack_564 = fVar187 + local_640._28_4_ + 7.0;
                    local_560 = local_620;
                    local_540 = local_800;
                    auVar170._8_4_ = 0x7f800000;
                    auVar170._0_8_ = 0x7f8000007f800000;
                    auVar170._12_4_ = 0x7f800000;
                    auVar170._16_4_ = 0x7f800000;
                    auVar170._20_4_ = 0x7f800000;
                    auVar170._24_4_ = 0x7f800000;
                    auVar170._28_4_ = 0x7f800000;
                    auVar122 = vblendmps_avx512vl(auVar170,local_800);
                    auVar145._0_4_ =
                         (uint)(bVar93 & 1) * auVar122._0_4_ |
                         (uint)!(bool)(bVar93 & 1) * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar94 >> 1) & 1);
                    auVar145._4_4_ = (uint)bVar13 * auVar122._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar94 >> 2) & 1);
                    auVar145._8_4_ = (uint)bVar13 * auVar122._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar94 >> 3) & 1);
                    auVar145._12_4_ = (uint)bVar13 * auVar122._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar94 >> 4) & 1);
                    auVar145._16_4_ = (uint)bVar13 * auVar122._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar94 >> 5) & 1);
                    auVar145._20_4_ = (uint)bVar13 * auVar122._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar94 >> 6) & 1);
                    auVar145._24_4_ = (uint)bVar13 * auVar122._24_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = SUB81(uVar94 >> 7,0);
                    auVar145._28_4_ = (uint)bVar13 * auVar122._28_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar122 = vshufps_avx(auVar145,auVar145,0xb1);
                    auVar122 = vminps_avx(auVar145,auVar122);
                    auVar123 = vshufpd_avx(auVar122,auVar122,5);
                    auVar122 = vminps_avx(auVar122,auVar123);
                    auVar123 = vpermpd_avx2(auVar122,0x4e);
                    auVar122 = vminps_avx(auVar122,auVar123);
                    uVar180 = vcmpps_avx512vl(auVar145,auVar122,0);
                    uVar86 = (uint)uVar94;
                    if (((byte)uVar180 & bVar93) != 0) {
                      uVar86 = (uint)((byte)uVar180 & bVar93);
                    }
                    uVar87 = 0;
                    for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x80000000) {
                      uVar87 = uVar87 + 1;
                    }
                    uVar85 = (ulong)uVar87;
                    pGVar83 = pGVar90;
                    local_600 = local_800;
                    local_5dc = iVar8;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar90->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      do {
                        local_818 = pGVar83;
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_580[uVar85]));
                        local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_560 + uVar85 * 4)))
                        ;
                        *(undefined4 *)(ray + k * 4 + 0x200) =
                             *(undefined4 *)(local_540 + uVar85 * 4);
                        local_848.context = context->user;
                        fVar179 = local_200._0_4_;
                        fVar231 = 1.0 - fVar179;
                        fVar187 = fVar231 * fVar231 * -3.0;
                        auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar231 * fVar231)),
                                                  ZEXT416((uint)(fVar179 * fVar231)),
                                                  ZEXT416(0xc0000000));
                        auVar98 = vfmsub132ss_fma(ZEXT416((uint)(fVar179 * fVar231)),
                                                  ZEXT416((uint)(fVar179 * fVar179)),
                                                  ZEXT416(0x40000000));
                        fVar231 = auVar97._0_4_ * 3.0;
                        fVar232 = auVar98._0_4_ * 3.0;
                        fVar179 = fVar179 * fVar179 * 3.0;
                        auVar222._0_4_ = fVar179 * fVar158;
                        auVar222._4_4_ = fVar179 * fVar176;
                        auVar222._8_4_ = fVar179 * fVar177;
                        auVar222._12_4_ = fVar179 * fVar178;
                        auVar163._4_4_ = fVar232;
                        auVar163._0_4_ = fVar232;
                        auVar163._8_4_ = fVar232;
                        auVar163._12_4_ = fVar232;
                        auVar97 = vfmadd132ps_fma(auVar163,auVar222,auVar102);
                        auVar205._4_4_ = fVar231;
                        auVar205._0_4_ = fVar231;
                        auVar205._8_4_ = fVar231;
                        auVar205._12_4_ = fVar231;
                        auVar97 = vfmadd132ps_fma(auVar205,auVar97,auVar28);
                        auVar164._4_4_ = fVar187;
                        auVar164._0_4_ = fVar187;
                        auVar164._8_4_ = fVar187;
                        auVar164._12_4_ = fVar187;
                        auVar97 = vfmadd132ps_fma(auVar164,auVar97,auVar27);
                        auVar247 = vbroadcastss_avx512f(auVar97);
                        auVar175 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar216 = vpermps_avx512f(auVar175,ZEXT1664(auVar97));
                        auVar224 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar224,ZEXT1664(auVar97));
                        local_2c0[0] = (RTCHitN)auVar247[0];
                        local_2c0[1] = (RTCHitN)auVar247[1];
                        local_2c0[2] = (RTCHitN)auVar247[2];
                        local_2c0[3] = (RTCHitN)auVar247[3];
                        local_2c0[4] = (RTCHitN)auVar247[4];
                        local_2c0[5] = (RTCHitN)auVar247[5];
                        local_2c0[6] = (RTCHitN)auVar247[6];
                        local_2c0[7] = (RTCHitN)auVar247[7];
                        local_2c0[8] = (RTCHitN)auVar247[8];
                        local_2c0[9] = (RTCHitN)auVar247[9];
                        local_2c0[10] = (RTCHitN)auVar247[10];
                        local_2c0[0xb] = (RTCHitN)auVar247[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar247[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar247[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar247[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar247[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar247[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar247[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar247[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar247[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar247[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar247[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar247[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar247[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar247[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar247[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar247[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar247[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar247[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar247[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar247[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar247[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar247[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar247[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar247[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar247[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar247[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar247[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar247[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar247[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar247[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar247[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar247[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar247[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar247[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar247[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar247[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar247[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar247[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar247[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar247[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar247[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar247[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar247[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar247[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar247[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar247[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar247[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar247[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar247[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar247[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar247[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar247[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar247[0x3f];
                        local_280 = auVar216;
                        local_180 = local_440._0_8_;
                        uStack_178 = local_440._8_8_;
                        uStack_170 = local_440._16_8_;
                        uStack_168 = local_440._24_8_;
                        uStack_160 = local_440._32_8_;
                        uStack_158 = local_440._40_8_;
                        uStack_150 = local_440._48_8_;
                        uStack_148 = local_440._56_8_;
                        auVar247 = vmovdqa64_avx512f(local_480);
                        local_140 = vmovdqa64_avx512f(auVar247);
                        auVar122 = vpcmpeqd_avx2(auVar247._0_32_,auVar247._0_32_);
                        local_810[3] = auVar122;
                        local_810[2] = auVar122;
                        local_810[1] = auVar122;
                        *local_810 = auVar122;
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_848.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_848.context)->instPrimID[0]))
                        ;
                        auVar247 = vmovdqa64_avx512f(local_300);
                        local_780 = vmovdqa64_avx512f(auVar247);
                        local_848.valid = (int *)local_780;
                        local_848.geometryUserPtr = pGVar90->userPtr;
                        local_848.hit = local_2c0;
                        local_848.N = 0x10;
                        local_7e0 = auVar245._0_32_;
                        local_848.ray = (RTCRayN *)ray;
                        if (pGVar90->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar216 = ZEXT1664(auVar216._0_16_);
                          auVar224 = ZEXT1664(auVar224._0_16_);
                          (*pGVar90->intersectionFilterN)(&local_848);
                          auVar229 = ZEXT3264(local_800);
                          auVar245 = ZEXT3264(local_7e0);
                          auVar247 = vmovdqa64_avx512f(local_780);
                          pGVar90 = local_818;
                        }
                        uVar180 = vptestmd_avx512f(auVar247,auVar247);
                        if ((short)uVar180 == 0) {
LAB_01b84a0d:
                          *(int *)(ray + k * 4 + 0x200) = auVar245._0_4_;
                        }
                        else {
                          p_Var12 = context->args->filter;
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar90->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar216 = ZEXT1664(auVar216._0_16_);
                            auVar224 = ZEXT1664(auVar224._0_16_);
                            (*p_Var12)(&local_848);
                            auVar229 = ZEXT3264(local_800);
                            auVar245 = ZEXT3264(local_7e0);
                            auVar247 = vmovdqa64_avx512f(local_780);
                            pGVar90 = local_818;
                          }
                          uVar36 = vptestmd_avx512f(auVar247,auVar247);
                          if ((short)uVar36 == 0) goto LAB_01b84a0d;
                          iVar1 = *(int *)(local_848.hit + 4);
                          iVar2 = *(int *)(local_848.hit + 8);
                          iVar69 = *(int *)(local_848.hit + 0xc);
                          iVar70 = *(int *)(local_848.hit + 0x10);
                          iVar71 = *(int *)(local_848.hit + 0x14);
                          iVar72 = *(int *)(local_848.hit + 0x18);
                          iVar73 = *(int *)(local_848.hit + 0x1c);
                          iVar74 = *(int *)(local_848.hit + 0x20);
                          iVar75 = *(int *)(local_848.hit + 0x24);
                          iVar76 = *(int *)(local_848.hit + 0x28);
                          iVar77 = *(int *)(local_848.hit + 0x2c);
                          iVar78 = *(int *)(local_848.hit + 0x30);
                          iVar79 = *(int *)(local_848.hit + 0x34);
                          iVar80 = *(int *)(local_848.hit + 0x38);
                          iVar81 = *(int *)(local_848.hit + 0x3c);
                          bVar93 = (byte)uVar36;
                          bVar13 = (bool)((byte)(uVar36 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar36 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar36 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar36 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar36 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar36 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar36 >> 7) & 1);
                          bVar84 = (byte)(uVar36 >> 8);
                          bVar20 = (bool)((byte)(uVar36 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar36 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar36 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar36 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar36 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar36 >> 0xe) & 1);
                          bVar26 = SUB81(uVar36 >> 0xf,0);
                          *(uint *)(local_848.ray + 0x300) =
                               (uint)(bVar93 & 1) * *(int *)local_848.hit |
                               (uint)!(bool)(bVar93 & 1) * *(int *)(local_848.ray + 0x300);
                          *(uint *)(local_848.ray + 0x304) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_848.ray + 0x304);
                          *(uint *)(local_848.ray + 0x308) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_848.ray + 0x308);
                          *(uint *)(local_848.ray + 0x30c) =
                               (uint)bVar15 * iVar69 |
                               (uint)!bVar15 * *(int *)(local_848.ray + 0x30c);
                          *(uint *)(local_848.ray + 0x310) =
                               (uint)bVar16 * iVar70 |
                               (uint)!bVar16 * *(int *)(local_848.ray + 0x310);
                          *(uint *)(local_848.ray + 0x314) =
                               (uint)bVar17 * iVar71 |
                               (uint)!bVar17 * *(int *)(local_848.ray + 0x314);
                          *(uint *)(local_848.ray + 0x318) =
                               (uint)bVar18 * iVar72 |
                               (uint)!bVar18 * *(int *)(local_848.ray + 0x318);
                          *(uint *)(local_848.ray + 0x31c) =
                               (uint)bVar19 * iVar73 |
                               (uint)!bVar19 * *(int *)(local_848.ray + 0x31c);
                          *(uint *)(local_848.ray + 800) =
                               (uint)(bVar84 & 1) * iVar74 |
                               (uint)!(bool)(bVar84 & 1) * *(int *)(local_848.ray + 800);
                          *(uint *)(local_848.ray + 0x324) =
                               (uint)bVar20 * iVar75 |
                               (uint)!bVar20 * *(int *)(local_848.ray + 0x324);
                          *(uint *)(local_848.ray + 0x328) =
                               (uint)bVar21 * iVar76 |
                               (uint)!bVar21 * *(int *)(local_848.ray + 0x328);
                          *(uint *)(local_848.ray + 0x32c) =
                               (uint)bVar22 * iVar77 |
                               (uint)!bVar22 * *(int *)(local_848.ray + 0x32c);
                          *(uint *)(local_848.ray + 0x330) =
                               (uint)bVar23 * iVar78 |
                               (uint)!bVar23 * *(int *)(local_848.ray + 0x330);
                          *(uint *)(local_848.ray + 0x334) =
                               (uint)bVar24 * iVar79 |
                               (uint)!bVar24 * *(int *)(local_848.ray + 0x334);
                          *(uint *)(local_848.ray + 0x338) =
                               (uint)bVar25 * iVar80 |
                               (uint)!bVar25 * *(int *)(local_848.ray + 0x338);
                          *(uint *)(local_848.ray + 0x33c) =
                               (uint)bVar26 * iVar81 |
                               (uint)!bVar26 * *(int *)(local_848.ray + 0x33c);
                          iVar1 = *(int *)(local_848.hit + 0x44);
                          iVar2 = *(int *)(local_848.hit + 0x48);
                          iVar69 = *(int *)(local_848.hit + 0x4c);
                          iVar70 = *(int *)(local_848.hit + 0x50);
                          iVar71 = *(int *)(local_848.hit + 0x54);
                          iVar72 = *(int *)(local_848.hit + 0x58);
                          iVar73 = *(int *)(local_848.hit + 0x5c);
                          iVar74 = *(int *)(local_848.hit + 0x60);
                          iVar75 = *(int *)(local_848.hit + 100);
                          iVar76 = *(int *)(local_848.hit + 0x68);
                          iVar77 = *(int *)(local_848.hit + 0x6c);
                          iVar78 = *(int *)(local_848.hit + 0x70);
                          iVar79 = *(int *)(local_848.hit + 0x74);
                          iVar80 = *(int *)(local_848.hit + 0x78);
                          iVar81 = *(int *)(local_848.hit + 0x7c);
                          bVar13 = (bool)((byte)(uVar36 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar36 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar36 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar36 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar36 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar36 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar36 >> 7) & 1);
                          bVar20 = (bool)((byte)(uVar36 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar36 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar36 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar36 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar36 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar36 >> 0xe) & 1);
                          bVar26 = SUB81(uVar36 >> 0xf,0);
                          *(uint *)(local_848.ray + 0x340) =
                               (uint)(bVar93 & 1) * *(int *)(local_848.hit + 0x40) |
                               (uint)!(bool)(bVar93 & 1) * *(int *)(local_848.ray + 0x340);
                          *(uint *)(local_848.ray + 0x344) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_848.ray + 0x344);
                          *(uint *)(local_848.ray + 0x348) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_848.ray + 0x348);
                          *(uint *)(local_848.ray + 0x34c) =
                               (uint)bVar15 * iVar69 |
                               (uint)!bVar15 * *(int *)(local_848.ray + 0x34c);
                          *(uint *)(local_848.ray + 0x350) =
                               (uint)bVar16 * iVar70 |
                               (uint)!bVar16 * *(int *)(local_848.ray + 0x350);
                          *(uint *)(local_848.ray + 0x354) =
                               (uint)bVar17 * iVar71 |
                               (uint)!bVar17 * *(int *)(local_848.ray + 0x354);
                          *(uint *)(local_848.ray + 0x358) =
                               (uint)bVar18 * iVar72 |
                               (uint)!bVar18 * *(int *)(local_848.ray + 0x358);
                          *(uint *)(local_848.ray + 0x35c) =
                               (uint)bVar19 * iVar73 |
                               (uint)!bVar19 * *(int *)(local_848.ray + 0x35c);
                          *(uint *)(local_848.ray + 0x360) =
                               (uint)(bVar84 & 1) * iVar74 |
                               (uint)!(bool)(bVar84 & 1) * *(int *)(local_848.ray + 0x360);
                          *(uint *)(local_848.ray + 0x364) =
                               (uint)bVar20 * iVar75 |
                               (uint)!bVar20 * *(int *)(local_848.ray + 0x364);
                          *(uint *)(local_848.ray + 0x368) =
                               (uint)bVar21 * iVar76 |
                               (uint)!bVar21 * *(int *)(local_848.ray + 0x368);
                          *(uint *)(local_848.ray + 0x36c) =
                               (uint)bVar22 * iVar77 |
                               (uint)!bVar22 * *(int *)(local_848.ray + 0x36c);
                          *(uint *)(local_848.ray + 0x370) =
                               (uint)bVar23 * iVar78 |
                               (uint)!bVar23 * *(int *)(local_848.ray + 0x370);
                          *(uint *)(local_848.ray + 0x374) =
                               (uint)bVar24 * iVar79 |
                               (uint)!bVar24 * *(int *)(local_848.ray + 0x374);
                          *(uint *)(local_848.ray + 0x378) =
                               (uint)bVar25 * iVar80 |
                               (uint)!bVar25 * *(int *)(local_848.ray + 0x378);
                          *(uint *)(local_848.ray + 0x37c) =
                               (uint)bVar26 * iVar81 |
                               (uint)!bVar26 * *(int *)(local_848.ray + 0x37c);
                          iVar1 = *(int *)(local_848.hit + 0x84);
                          iVar2 = *(int *)(local_848.hit + 0x88);
                          iVar69 = *(int *)(local_848.hit + 0x8c);
                          iVar70 = *(int *)(local_848.hit + 0x90);
                          iVar71 = *(int *)(local_848.hit + 0x94);
                          iVar72 = *(int *)(local_848.hit + 0x98);
                          iVar73 = *(int *)(local_848.hit + 0x9c);
                          iVar74 = *(int *)(local_848.hit + 0xa0);
                          iVar75 = *(int *)(local_848.hit + 0xa4);
                          iVar76 = *(int *)(local_848.hit + 0xa8);
                          iVar77 = *(int *)(local_848.hit + 0xac);
                          iVar78 = *(int *)(local_848.hit + 0xb0);
                          iVar79 = *(int *)(local_848.hit + 0xb4);
                          iVar80 = *(int *)(local_848.hit + 0xb8);
                          iVar81 = *(int *)(local_848.hit + 0xbc);
                          bVar13 = (bool)((byte)(uVar36 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar36 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar36 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar36 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar36 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar36 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar36 >> 7) & 1);
                          bVar20 = (bool)((byte)(uVar36 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar36 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar36 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar36 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar36 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar36 >> 0xe) & 1);
                          bVar26 = SUB81(uVar36 >> 0xf,0);
                          *(uint *)(local_848.ray + 0x380) =
                               (uint)(bVar93 & 1) * *(int *)(local_848.hit + 0x80) |
                               (uint)!(bool)(bVar93 & 1) * *(int *)(local_848.ray + 0x380);
                          *(uint *)(local_848.ray + 900) =
                               (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_848.ray + 900);
                          *(uint *)(local_848.ray + 0x388) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_848.ray + 0x388);
                          *(uint *)(local_848.ray + 0x38c) =
                               (uint)bVar15 * iVar69 |
                               (uint)!bVar15 * *(int *)(local_848.ray + 0x38c);
                          *(uint *)(local_848.ray + 0x390) =
                               (uint)bVar16 * iVar70 |
                               (uint)!bVar16 * *(int *)(local_848.ray + 0x390);
                          *(uint *)(local_848.ray + 0x394) =
                               (uint)bVar17 * iVar71 |
                               (uint)!bVar17 * *(int *)(local_848.ray + 0x394);
                          *(uint *)(local_848.ray + 0x398) =
                               (uint)bVar18 * iVar72 |
                               (uint)!bVar18 * *(int *)(local_848.ray + 0x398);
                          *(uint *)(local_848.ray + 0x39c) =
                               (uint)bVar19 * iVar73 |
                               (uint)!bVar19 * *(int *)(local_848.ray + 0x39c);
                          *(uint *)(local_848.ray + 0x3a0) =
                               (uint)(bVar84 & 1) * iVar74 |
                               (uint)!(bool)(bVar84 & 1) * *(int *)(local_848.ray + 0x3a0);
                          *(uint *)(local_848.ray + 0x3a4) =
                               (uint)bVar20 * iVar75 |
                               (uint)!bVar20 * *(int *)(local_848.ray + 0x3a4);
                          *(uint *)(local_848.ray + 0x3a8) =
                               (uint)bVar21 * iVar76 |
                               (uint)!bVar21 * *(int *)(local_848.ray + 0x3a8);
                          *(uint *)(local_848.ray + 0x3ac) =
                               (uint)bVar22 * iVar77 |
                               (uint)!bVar22 * *(int *)(local_848.ray + 0x3ac);
                          *(uint *)(local_848.ray + 0x3b0) =
                               (uint)bVar23 * iVar78 |
                               (uint)!bVar23 * *(int *)(local_848.ray + 0x3b0);
                          *(uint *)(local_848.ray + 0x3b4) =
                               (uint)bVar24 * iVar79 |
                               (uint)!bVar24 * *(int *)(local_848.ray + 0x3b4);
                          *(uint *)(local_848.ray + 0x3b8) =
                               (uint)bVar25 * iVar80 |
                               (uint)!bVar25 * *(int *)(local_848.ray + 0x3b8);
                          *(uint *)(local_848.ray + 0x3bc) =
                               (uint)bVar26 * iVar81 |
                               (uint)!bVar26 * *(int *)(local_848.ray + 0x3bc);
                          iVar1 = *(int *)(local_848.hit + 0xc4);
                          iVar2 = *(int *)(local_848.hit + 200);
                          iVar69 = *(int *)(local_848.hit + 0xcc);
                          iVar70 = *(int *)(local_848.hit + 0xd0);
                          iVar71 = *(int *)(local_848.hit + 0xd4);
                          iVar72 = *(int *)(local_848.hit + 0xd8);
                          iVar73 = *(int *)(local_848.hit + 0xdc);
                          iVar74 = *(int *)(local_848.hit + 0xe0);
                          iVar75 = *(int *)(local_848.hit + 0xe4);
                          iVar76 = *(int *)(local_848.hit + 0xe8);
                          iVar77 = *(int *)(local_848.hit + 0xec);
                          iVar78 = *(int *)(local_848.hit + 0xf0);
                          iVar79 = *(int *)(local_848.hit + 0xf4);
                          iVar80 = *(int *)(local_848.hit + 0xf8);
                          iVar81 = *(int *)(local_848.hit + 0xfc);
                          bVar13 = (bool)((byte)(uVar36 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar36 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar36 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar36 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar36 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar36 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar36 >> 7) & 1);
                          bVar20 = (bool)((byte)(uVar36 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar36 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar36 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar36 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar36 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar36 >> 0xe) & 1);
                          bVar26 = SUB81(uVar36 >> 0xf,0);
                          *(uint *)(local_848.ray + 0x3c0) =
                               (uint)(bVar93 & 1) * *(int *)(local_848.hit + 0xc0) |
                               (uint)!(bool)(bVar93 & 1) * *(int *)(local_848.ray + 0x3c0);
                          *(uint *)(local_848.ray + 0x3c4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_848.ray + 0x3c4);
                          *(uint *)(local_848.ray + 0x3c8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_848.ray + 0x3c8);
                          *(uint *)(local_848.ray + 0x3cc) =
                               (uint)bVar15 * iVar69 |
                               (uint)!bVar15 * *(int *)(local_848.ray + 0x3cc);
                          *(uint *)(local_848.ray + 0x3d0) =
                               (uint)bVar16 * iVar70 |
                               (uint)!bVar16 * *(int *)(local_848.ray + 0x3d0);
                          *(uint *)(local_848.ray + 0x3d4) =
                               (uint)bVar17 * iVar71 |
                               (uint)!bVar17 * *(int *)(local_848.ray + 0x3d4);
                          *(uint *)(local_848.ray + 0x3d8) =
                               (uint)bVar18 * iVar72 |
                               (uint)!bVar18 * *(int *)(local_848.ray + 0x3d8);
                          *(uint *)(local_848.ray + 0x3dc) =
                               (uint)bVar19 * iVar73 |
                               (uint)!bVar19 * *(int *)(local_848.ray + 0x3dc);
                          *(uint *)(local_848.ray + 0x3e0) =
                               (uint)(bVar84 & 1) * iVar74 |
                               (uint)!(bool)(bVar84 & 1) * *(int *)(local_848.ray + 0x3e0);
                          *(uint *)(local_848.ray + 0x3e4) =
                               (uint)bVar20 * iVar75 |
                               (uint)!bVar20 * *(int *)(local_848.ray + 0x3e4);
                          *(uint *)(local_848.ray + 1000) =
                               (uint)bVar21 * iVar76 |
                               (uint)!bVar21 * *(int *)(local_848.ray + 1000);
                          *(uint *)(local_848.ray + 0x3ec) =
                               (uint)bVar22 * iVar77 |
                               (uint)!bVar22 * *(int *)(local_848.ray + 0x3ec);
                          *(uint *)(local_848.ray + 0x3f0) =
                               (uint)bVar23 * iVar78 |
                               (uint)!bVar23 * *(int *)(local_848.ray + 0x3f0);
                          *(uint *)(local_848.ray + 0x3f4) =
                               (uint)bVar24 * iVar79 |
                               (uint)!bVar24 * *(int *)(local_848.ray + 0x3f4);
                          *(uint *)(local_848.ray + 0x3f8) =
                               (uint)bVar25 * iVar80 |
                               (uint)!bVar25 * *(int *)(local_848.ray + 0x3f8);
                          *(uint *)(local_848.ray + 0x3fc) =
                               (uint)bVar26 * iVar81 |
                               (uint)!bVar26 * *(int *)(local_848.ray + 0x3fc);
                          iVar1 = *(int *)(local_848.hit + 0x104);
                          iVar2 = *(int *)(local_848.hit + 0x108);
                          iVar69 = *(int *)(local_848.hit + 0x10c);
                          iVar70 = *(int *)(local_848.hit + 0x110);
                          iVar71 = *(int *)(local_848.hit + 0x114);
                          iVar72 = *(int *)(local_848.hit + 0x118);
                          iVar73 = *(int *)(local_848.hit + 0x11c);
                          iVar74 = *(int *)(local_848.hit + 0x120);
                          iVar75 = *(int *)(local_848.hit + 0x124);
                          iVar76 = *(int *)(local_848.hit + 0x128);
                          iVar77 = *(int *)(local_848.hit + 300);
                          iVar78 = *(int *)(local_848.hit + 0x130);
                          iVar79 = *(int *)(local_848.hit + 0x134);
                          iVar80 = *(int *)(local_848.hit + 0x138);
                          iVar81 = *(int *)(local_848.hit + 0x13c);
                          bVar13 = (bool)((byte)(uVar36 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar36 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar36 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar36 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar36 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar36 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar36 >> 7) & 1);
                          bVar20 = (bool)((byte)(uVar36 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar36 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar36 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar36 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar36 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar36 >> 0xe) & 1);
                          bVar26 = SUB81(uVar36 >> 0xf,0);
                          *(uint *)(local_848.ray + 0x400) =
                               (uint)(bVar93 & 1) * *(int *)(local_848.hit + 0x100) |
                               (uint)!(bool)(bVar93 & 1) * *(int *)(local_848.ray + 0x400);
                          *(uint *)(local_848.ray + 0x404) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_848.ray + 0x404);
                          *(uint *)(local_848.ray + 0x408) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_848.ray + 0x408);
                          *(uint *)(local_848.ray + 0x40c) =
                               (uint)bVar15 * iVar69 |
                               (uint)!bVar15 * *(int *)(local_848.ray + 0x40c);
                          *(uint *)(local_848.ray + 0x410) =
                               (uint)bVar16 * iVar70 |
                               (uint)!bVar16 * *(int *)(local_848.ray + 0x410);
                          *(uint *)(local_848.ray + 0x414) =
                               (uint)bVar17 * iVar71 |
                               (uint)!bVar17 * *(int *)(local_848.ray + 0x414);
                          *(uint *)(local_848.ray + 0x418) =
                               (uint)bVar18 * iVar72 |
                               (uint)!bVar18 * *(int *)(local_848.ray + 0x418);
                          *(uint *)(local_848.ray + 0x41c) =
                               (uint)bVar19 * iVar73 |
                               (uint)!bVar19 * *(int *)(local_848.ray + 0x41c);
                          *(uint *)(local_848.ray + 0x420) =
                               (uint)(bVar84 & 1) * iVar74 |
                               (uint)!(bool)(bVar84 & 1) * *(int *)(local_848.ray + 0x420);
                          *(uint *)(local_848.ray + 0x424) =
                               (uint)bVar20 * iVar75 |
                               (uint)!bVar20 * *(int *)(local_848.ray + 0x424);
                          *(uint *)(local_848.ray + 0x428) =
                               (uint)bVar21 * iVar76 |
                               (uint)!bVar21 * *(int *)(local_848.ray + 0x428);
                          *(uint *)(local_848.ray + 0x42c) =
                               (uint)bVar22 * iVar77 |
                               (uint)!bVar22 * *(int *)(local_848.ray + 0x42c);
                          *(uint *)(local_848.ray + 0x430) =
                               (uint)bVar23 * iVar78 |
                               (uint)!bVar23 * *(int *)(local_848.ray + 0x430);
                          *(uint *)(local_848.ray + 0x434) =
                               (uint)bVar24 * iVar79 |
                               (uint)!bVar24 * *(int *)(local_848.ray + 0x434);
                          *(uint *)(local_848.ray + 0x438) =
                               (uint)bVar25 * iVar80 |
                               (uint)!bVar25 * *(int *)(local_848.ray + 0x438);
                          *(uint *)(local_848.ray + 0x43c) =
                               (uint)bVar26 * iVar81 |
                               (uint)!bVar26 * *(int *)(local_848.ray + 0x43c);
                          auVar247 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_848.hit + 0x140)
                                                      );
                          auVar247 = vmovdqu32_avx512f(auVar247);
                          *(undefined1 (*) [64])(local_848.ray + 0x440) = auVar247;
                          auVar247 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_848.hit + 0x180)
                                                      );
                          auVar247 = vmovdqu32_avx512f(auVar247);
                          *(undefined1 (*) [64])(local_848.ray + 0x480) = auVar247;
                          auVar247 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_848.hit + 0x1c0)
                                                      );
                          auVar247 = vmovdqa32_avx512f(auVar247);
                          *(undefined1 (*) [64])(local_848.ray + 0x4c0) = auVar247;
                          auVar247 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_848.hit + 0x200)
                                                      );
                          auVar247 = vmovdqa32_avx512f(auVar247);
                          *(undefined1 (*) [64])(local_848.ray + 0x500) = auVar247;
                          auVar245 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
                        }
                        bVar93 = ~(byte)(1 << ((uint)uVar85 & 0x1f)) & (byte)uVar94;
                        uVar159 = auVar245._0_4_;
                        auVar171._4_4_ = uVar159;
                        auVar171._0_4_ = uVar159;
                        auVar171._8_4_ = uVar159;
                        auVar171._12_4_ = uVar159;
                        auVar171._16_4_ = uVar159;
                        auVar171._20_4_ = uVar159;
                        auVar171._24_4_ = uVar159;
                        auVar171._28_4_ = uVar159;
                        uVar180 = vcmpps_avx512vl(auVar229._0_32_,auVar171,2);
                        if ((bVar93 & (byte)uVar180) == 0) goto LAB_01b84a9c;
                        bVar93 = bVar93 & (byte)uVar180;
                        uVar94 = (ulong)bVar93;
                        auVar172._8_4_ = 0x7f800000;
                        auVar172._0_8_ = 0x7f8000007f800000;
                        auVar172._12_4_ = 0x7f800000;
                        auVar172._16_4_ = 0x7f800000;
                        auVar172._20_4_ = 0x7f800000;
                        auVar172._24_4_ = 0x7f800000;
                        auVar172._28_4_ = 0x7f800000;
                        auVar122 = vblendmps_avx512vl(auVar172,auVar229._0_32_);
                        auVar146._0_4_ =
                             (uint)(bVar93 & 1) * auVar122._0_4_ |
                             (uint)!(bool)(bVar93 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar93 >> 1 & 1);
                        auVar146._4_4_ = (uint)bVar13 * auVar122._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar93 >> 2 & 1);
                        auVar146._8_4_ = (uint)bVar13 * auVar122._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar93 >> 3 & 1);
                        auVar146._12_4_ =
                             (uint)bVar13 * auVar122._12_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar93 >> 4 & 1);
                        auVar146._16_4_ =
                             (uint)bVar13 * auVar122._16_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar93 >> 5 & 1);
                        auVar146._20_4_ =
                             (uint)bVar13 * auVar122._20_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar93 >> 6 & 1);
                        auVar146._24_4_ =
                             (uint)bVar13 * auVar122._24_4_ | (uint)!bVar13 * 0x7f800000;
                        auVar146._28_4_ =
                             (uint)(bVar93 >> 7) * auVar122._28_4_ |
                             (uint)!(bool)(bVar93 >> 7) * 0x7f800000;
                        auVar122 = vshufps_avx(auVar146,auVar146,0xb1);
                        auVar122 = vminps_avx(auVar146,auVar122);
                        auVar123 = vshufpd_avx(auVar122,auVar122,5);
                        auVar122 = vminps_avx(auVar122,auVar123);
                        auVar123 = vpermpd_avx2(auVar122,0x4e);
                        auVar122 = vminps_avx(auVar122,auVar123);
                        uVar180 = vcmpps_avx512vl(auVar146,auVar122,0);
                        bVar84 = (byte)uVar180 & bVar93;
                        if (bVar84 != 0) {
                          bVar93 = bVar84;
                        }
                        uVar86 = 0;
                        for (uVar87 = (uint)bVar93; (uVar87 & 1) == 0;
                            uVar87 = uVar87 >> 1 | 0x80000000) {
                          uVar86 = uVar86 + 1;
                        }
                        uVar85 = (ulong)uVar86;
                        pGVar83 = local_818;
                      } while( true );
                    }
                    fVar187 = local_580[uVar85];
                    uVar159 = *(undefined4 *)(local_560 + uVar85 * 4);
                    fVar232 = 1.0 - fVar187;
                    fVar231 = fVar232 * fVar232 * -3.0;
                    auVar216 = ZEXT464((uint)fVar231);
                    auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar232 * fVar232)),
                                              ZEXT416((uint)(fVar187 * fVar232)),ZEXT416(0xc0000000)
                                             );
                    auVar98 = vfmsub132ss_fma(ZEXT416((uint)(fVar187 * fVar232)),
                                              ZEXT416((uint)(fVar187 * fVar187)),ZEXT416(0x40000000)
                                             );
                    fVar232 = auVar97._0_4_ * 3.0;
                    fVar179 = auVar98._0_4_ * 3.0;
                    fVar186 = fVar187 * fVar187 * 3.0;
                    auVar221._0_4_ = fVar186 * fVar158;
                    auVar221._4_4_ = fVar186 * fVar176;
                    auVar221._8_4_ = fVar186 * fVar177;
                    auVar221._12_4_ = fVar186 * fVar178;
                    auVar224 = ZEXT1664(auVar221);
                    auVar195._4_4_ = fVar179;
                    auVar195._0_4_ = fVar179;
                    auVar195._8_4_ = fVar179;
                    auVar195._12_4_ = fVar179;
                    auVar97 = vfmadd132ps_fma(auVar195,auVar221,auVar102);
                    auVar204._4_4_ = fVar232;
                    auVar204._0_4_ = fVar232;
                    auVar204._8_4_ = fVar232;
                    auVar204._12_4_ = fVar232;
                    auVar97 = vfmadd132ps_fma(auVar204,auVar97,auVar28);
                    auVar196._4_4_ = fVar231;
                    auVar196._0_4_ = fVar231;
                    auVar196._8_4_ = fVar231;
                    auVar196._12_4_ = fVar231;
                    auVar97 = vfmadd132ps_fma(auVar196,auVar97,auVar27);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_540 + uVar85 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar97._0_4_;
                    uVar9 = vextractps_avx(auVar97,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar9;
                    uVar9 = vextractps_avx(auVar97,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar9;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar187;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar159;
                    *(uint *)(ray + k * 4 + 0x440) = uVar7;
                    *(uint *)(ray + k * 4 + 0x480) = uVar91;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01b846df;
      }
LAB_01b83d54:
      uVar159 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar38._4_4_ = uVar159;
      auVar38._0_4_ = uVar159;
      auVar38._8_4_ = uVar159;
      auVar38._12_4_ = uVar159;
      uVar180 = vcmpps_avx512vl(local_510,auVar38,2);
      uVar91 = (uint)uVar92 & (uint)uVar92 + 0xf & (uint)uVar180;
      uVar92 = (ulong)uVar91;
    } while (uVar91 != 0);
  }
  return;
LAB_01b84a9c:
  auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar247 = ZEXT1664(auVar97);
  auVar175 = ZEXT464(0xbf800000);
LAB_01b846df:
  lVar88 = lVar88 + 8;
  if (iVar8 <= (int)lVar88) goto LAB_01b83d54;
  goto LAB_01b83e06;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }